

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [12];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  uint uVar67;
  undefined1 (*pauVar68) [32];
  uint uVar69;
  uint uVar70;
  long lVar71;
  ulong uVar72;
  ulong uVar73;
  int iVar74;
  ulong uVar75;
  float fVar76;
  undefined8 uVar78;
  float fVar112;
  vint4 bi_2;
  undefined1 auVar79 [16];
  float fVar111;
  float fVar113;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined4 uVar77;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar91 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar92 [16];
  undefined1 auVar108 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar109 [32];
  undefined1 extraout_var [60];
  undefined1 auVar110 [64];
  float fVar114;
  undefined8 extraout_XMM1_Qa;
  float fVar138;
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 extraout_var_01 [56];
  undefined1 auVar135 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar159;
  float fVar183;
  float fVar184;
  vint4 ai_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar185;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  vint4 ai;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [28];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  vint4 bi;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar233;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  vint4 ai_1;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar246;
  undefined1 auVar245 [64];
  float fVar247;
  float fVar252;
  float fVar253;
  undefined1 auVar248 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  float fVar267;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar272 [28];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c48;
  uint uStack_b64;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined4 uStack_9a4;
  ulong local_9a0;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  uint uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var_00 [60];
  undefined1 auVar134 [64];
  undefined1 auVar136 [64];
  undefined1 auVar249 [16];
  
  PVar1 = prim[1];
  uVar73 = (ulong)(byte)PVar1;
  fVar76 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar79._0_4_ = fVar76 * auVar5._0_4_;
  auVar79._4_4_ = fVar76 * auVar5._4_4_;
  auVar79._8_4_ = fVar76 * auVar5._8_4_;
  auVar79._12_4_ = fVar76 * auVar5._12_4_;
  auVar206._0_4_ = fVar76 * auVar6._0_4_;
  auVar206._4_4_ = fVar76 * auVar6._4_4_;
  auVar206._8_4_ = fVar76 * auVar6._8_4_;
  auVar206._12_4_ = fVar76 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar73 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  uVar75 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 + uVar73 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar75 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar266 = ZEXT1664(auVar147);
  auVar268._4_4_ = auVar206._0_4_;
  auVar268._0_4_ = auVar206._0_4_;
  auVar268._8_4_ = auVar206._0_4_;
  auVar268._12_4_ = auVar206._0_4_;
  auVar116 = vshufps_avx(auVar206,auVar206,0x55);
  auVar80 = vshufps_avx(auVar206,auVar206,0xaa);
  fVar76 = auVar80._0_4_;
  auVar248._0_4_ = fVar76 * auVar7._0_4_;
  fVar111 = auVar80._4_4_;
  auVar248._4_4_ = fVar111 * auVar7._4_4_;
  fVar112 = auVar80._8_4_;
  auVar248._8_4_ = fVar112 * auVar7._8_4_;
  fVar113 = auVar80._12_4_;
  auVar248._12_4_ = fVar113 * auVar7._12_4_;
  auVar242._0_4_ = auVar9._0_4_ * fVar76;
  auVar242._4_4_ = auVar9._4_4_ * fVar111;
  auVar242._8_4_ = auVar9._8_4_ * fVar112;
  auVar242._12_4_ = auVar9._12_4_ * fVar113;
  auVar234._0_4_ = auVar147._0_4_ * fVar76;
  auVar234._4_4_ = auVar147._4_4_ * fVar111;
  auVar234._8_4_ = auVar147._8_4_ * fVar112;
  auVar234._12_4_ = auVar147._12_4_ * fVar113;
  auVar80 = vfmadd231ps_fma(auVar248,auVar116,auVar6);
  auVar117 = vfmadd231ps_fma(auVar242,auVar116,auVar166);
  auVar116 = vfmadd231ps_fma(auVar234,auVar81,auVar116);
  auVar88 = vfmadd231ps_fma(auVar80,auVar268,auVar5);
  auVar117 = vfmadd231ps_fma(auVar117,auVar268,auVar8);
  auVar190 = vfmadd231ps_fma(auVar116,auVar82,auVar268);
  auVar269._4_4_ = auVar79._0_4_;
  auVar269._0_4_ = auVar79._0_4_;
  auVar269._8_4_ = auVar79._0_4_;
  auVar269._12_4_ = auVar79._0_4_;
  auVar116 = vshufps_avx(auVar79,auVar79,0x55);
  auVar80 = vshufps_avx(auVar79,auVar79,0xaa);
  fVar76 = auVar80._0_4_;
  auVar207._0_4_ = fVar76 * auVar7._0_4_;
  fVar111 = auVar80._4_4_;
  auVar207._4_4_ = fVar111 * auVar7._4_4_;
  fVar112 = auVar80._8_4_;
  auVar207._8_4_ = fVar112 * auVar7._8_4_;
  fVar113 = auVar80._12_4_;
  auVar207._12_4_ = fVar113 * auVar7._12_4_;
  auVar115._0_4_ = auVar9._0_4_ * fVar76;
  auVar115._4_4_ = auVar9._4_4_ * fVar111;
  auVar115._8_4_ = auVar9._8_4_ * fVar112;
  auVar115._12_4_ = auVar9._12_4_ * fVar113;
  auVar80._0_4_ = auVar147._0_4_ * fVar76;
  auVar80._4_4_ = auVar147._4_4_ * fVar111;
  auVar80._8_4_ = auVar147._8_4_ * fVar112;
  auVar80._12_4_ = auVar147._12_4_ * fVar113;
  auVar6 = vfmadd231ps_fma(auVar207,auVar116,auVar6);
  auVar7 = vfmadd231ps_fma(auVar115,auVar116,auVar166);
  auVar166 = vfmadd231ps_fma(auVar80,auVar116,auVar81);
  auVar9 = vfmadd231ps_fma(auVar6,auVar269,auVar5);
  auVar81 = vfmadd231ps_fma(auVar7,auVar269,auVar8);
  auVar147 = vfmadd231ps_fma(auVar166,auVar269,auVar82);
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar88,auVar225);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar189,1);
  auVar6 = vblendvps_avx(auVar88,auVar189,auVar5);
  auVar5 = vandps_avx(auVar117,auVar225);
  auVar5 = vcmpps_avx(auVar5,auVar189,1);
  auVar7 = vblendvps_avx(auVar117,auVar189,auVar5);
  auVar5 = vandps_avx(auVar190,auVar225);
  auVar5 = vcmpps_avx(auVar5,auVar189,1);
  auVar5 = vblendvps_avx(auVar190,auVar189,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar226);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar226);
  auVar166 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar226);
  auVar82 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar9);
  auVar190._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar190._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar190._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar190._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar9);
  auVar208._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar208._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar208._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar208._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar117._1_3_ = 0;
  auVar117[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar73 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar81);
  auVar235._0_4_ = auVar5._0_4_ * auVar166._0_4_;
  auVar235._4_4_ = auVar5._4_4_ * auVar166._4_4_;
  auVar235._8_4_ = auVar5._8_4_ * auVar166._8_4_;
  auVar235._12_4_ = auVar5._12_4_ * auVar166._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar81);
  auVar116._0_4_ = auVar166._0_4_ * auVar5._0_4_;
  auVar116._4_4_ = auVar166._4_4_ * auVar5._4_4_;
  auVar116._8_4_ = auVar166._8_4_ * auVar5._8_4_;
  auVar116._12_4_ = auVar166._12_4_ * auVar5._12_4_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar75 + uVar73 + 6);
  auVar5 = vpmovsxwd_avx(auVar166);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar147);
  auVar88._0_4_ = auVar82._0_4_ * auVar5._0_4_;
  auVar88._4_4_ = auVar82._4_4_ * auVar5._4_4_;
  auVar88._8_4_ = auVar82._8_4_ * auVar5._8_4_;
  auVar88._12_4_ = auVar82._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar147);
  auVar81._0_4_ = auVar82._0_4_ * auVar5._0_4_;
  auVar81._4_4_ = auVar82._4_4_ * auVar5._4_4_;
  auVar81._8_4_ = auVar82._8_4_ * auVar5._8_4_;
  auVar81._12_4_ = auVar82._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar190,auVar208);
  auVar6 = vpminsd_avx(auVar235,auVar116);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar88,auVar81);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar239._4_4_ = uVar77;
  auVar239._0_4_ = uVar77;
  auVar239._8_4_ = uVar77;
  auVar239._12_4_ = uVar77;
  auVar6 = vmaxps_avx(auVar6,auVar239);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_560._0_4_ = auVar5._0_4_ * 0.99999964;
  local_560._4_4_ = auVar5._4_4_ * 0.99999964;
  local_560._8_4_ = auVar5._8_4_ * 0.99999964;
  local_560._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar190,auVar208);
  auVar6 = vpmaxsd_avx(auVar235,auVar116);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar88,auVar81);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar147._4_4_ = uVar77;
  auVar147._0_4_ = uVar77;
  auVar147._8_4_ = uVar77;
  auVar147._12_4_ = uVar77;
  auVar6 = vminps_avx(auVar6,auVar147);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar82._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar82._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar82._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar82._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar117[4] = PVar1;
  auVar117._5_3_ = 0;
  auVar117[8] = PVar1;
  auVar117._9_3_ = 0;
  auVar117[0xc] = PVar1;
  auVar117._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar117,_DAT_01f7fcf0);
  auVar5 = vcmpps_avx(local_560,auVar82,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar67 = vmovmskps_avx(auVar5);
  if (uVar67 == 0) {
    return;
  }
  uVar67 = uVar67 & 0xff;
  auVar94._16_16_ = mm_lookupmask_ps._240_16_;
  auVar94._0_16_ = mm_lookupmask_ps._240_16_;
  local_4e0 = vblendps_avx(auVar94,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_8a0 = 0x7fffffff;
  uStack_89c = 0x7fffffff;
  uStack_898 = 0x7fffffff;
  uStack_894 = 0x7fffffff;
  uStack_890 = 0x7fffffff;
  uStack_88c = 0x7fffffff;
  uStack_888 = 0x7fffffff;
  uStack_884 = 0x7fffffff;
  local_660 = 0x80000000;
  uStack_65c = 0x80000000;
  uStack_658 = 0x80000000;
  uStack_654 = 0x80000000;
  fStack_650 = -0.0;
  fStack_64c = -0.0;
  fStack_648 = -0.0;
  uStack_644 = 0x80000000;
  local_8e8 = prim;
LAB_016328ec:
  lVar71 = 0;
  uVar73 = (ulong)uVar67;
  for (uVar75 = uVar73; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar71 = lVar71 + 1;
  }
  uVar67 = *(uint *)(local_8e8 + 2);
  local_760 = *(uint *)(local_8e8 + lVar71 * 4 + 6);
  local_9a0 = (ulong)local_760;
  pGVar3 = (context->scene->geometries).items[uVar67].ptr;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_9a0);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar71 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar71 + (long)p_Var4 * uVar75);
  auVar6 = *(undefined1 (*) [16])(lVar71 + (uVar75 + 1) * (long)p_Var4);
  auVar7 = *(undefined1 (*) [16])(lVar71 + (uVar75 + 2) * (long)p_Var4);
  uVar73 = uVar73 - 1 & uVar73;
  auVar8 = *(undefined1 (*) [16])(lVar71 + (uVar75 + 3) * (long)p_Var4);
  if (uVar73 != 0) {
    uVar72 = uVar73 - 1 & uVar73;
    for (uVar75 = uVar73; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    }
    if (uVar72 != 0) {
      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar166 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar9 = vinsertps_avx(auVar166,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar243._4_4_ = uVar77;
  auVar243._0_4_ = uVar77;
  auVar243._8_4_ = uVar77;
  auVar243._12_4_ = uVar77;
  fStack_850 = (float)uVar77;
  _local_860 = auVar243;
  fStack_84c = (float)uVar77;
  fStack_848 = (float)uVar77;
  register0x0000149c = uVar77;
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar249._4_4_ = uVar77;
  auVar249._0_4_ = uVar77;
  auVar249._8_4_ = uVar77;
  auVar249._12_4_ = uVar77;
  fStack_830 = (float)uVar77;
  _local_840 = auVar249;
  fStack_82c = (float)uVar77;
  fStack_828 = (float)uVar77;
  register0x000014dc = uVar77;
  auVar250 = ZEXT3264(_local_840);
  auVar166 = vunpcklps_avx(auVar243,auVar249);
  fVar76 = *(float *)(ray + k * 4 + 0x60);
  auVar258._4_4_ = fVar76;
  auVar258._0_4_ = fVar76;
  auVar258._8_4_ = fVar76;
  auVar258._12_4_ = fVar76;
  fStack_9b0 = fVar76;
  _local_9c0 = auVar258;
  fStack_9ac = fVar76;
  fStack_9a8 = fVar76;
  uStack_9a4 = fVar76;
  local_9d0 = vinsertps_avx(auVar166,auVar258,0x28);
  auVar238 = ZEXT1664(local_9d0);
  auVar209._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_ + auVar8._0_4_) * 0.25;
  auVar209._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_ + auVar8._4_4_) * 0.25;
  auVar209._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_ + auVar8._8_4_) * 0.25;
  auVar209._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_ + auVar8._12_4_) * 0.25;
  auVar166 = vsubps_avx(auVar209,auVar9);
  auVar166 = vdpps_avx(auVar166,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar241 = ZEXT1664(local_9e0);
  auVar82 = vrcpss_avx(local_9e0,local_9e0);
  auVar81 = vfnmadd213ss_fma(auVar82,local_9e0,ZEXT416(0x40000000));
  local_360 = auVar166._0_4_ * auVar82._0_4_ * auVar81._0_4_;
  auVar220._4_4_ = local_360;
  auVar220._0_4_ = local_360;
  auVar220._8_4_ = local_360;
  auVar220._12_4_ = local_360;
  fStack_970 = local_360;
  _local_980 = auVar220;
  fStack_96c = local_360;
  fStack_968 = local_360;
  fStack_964 = local_360;
  auVar166 = vfmadd231ps_fma(auVar9,local_9d0,auVar220);
  auVar166 = vblendps_avx(auVar166,_DAT_01f7aa10,8);
  auVar9 = vsubps_avx(auVar5,auVar166);
  auVar82 = vsubps_avx(auVar7,auVar166);
  auVar81 = vsubps_avx(auVar6,auVar166);
  auVar8 = vsubps_avx(auVar8,auVar166);
  auVar5 = vmovshdup_avx(auVar9);
  uVar78 = auVar5._0_8_;
  auVar273._8_8_ = uVar78;
  auVar273._0_8_ = uVar78;
  auVar273._16_8_ = uVar78;
  auVar273._24_8_ = uVar78;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar78 = auVar5._0_8_;
  local_a80._8_8_ = uVar78;
  local_a80._0_8_ = uVar78;
  local_a80._16_8_ = uVar78;
  local_a80._24_8_ = uVar78;
  auVar271 = ZEXT3264(local_a80);
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vmovshdup_avx(auVar81);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar81,auVar81,0xaa);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar6 = vshufps_avx(auVar81,auVar81,0xff);
  uVar78 = auVar6._0_8_;
  auVar227._8_8_ = uVar78;
  auVar227._0_8_ = uVar78;
  auVar227._16_8_ = uVar78;
  auVar227._24_8_ = uVar78;
  auVar5 = vmovshdup_avx(auVar82);
  local_4a0 = auVar5._0_4_;
  fStack_49c = auVar5._4_4_;
  auVar5 = vshufps_avx(auVar82,auVar82,0xaa);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vshufps_avx(auVar82,auVar82,0xff);
  local_4c0 = auVar5._0_4_;
  fStack_4bc = auVar5._4_4_;
  auVar5 = vmovshdup_avx(auVar8);
  local_260 = auVar5._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_280 = auVar5._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_2a0 = auVar5._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar76 * fVar76)),_local_840,_local_840);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_860,_local_860);
  uVar77 = auVar5._0_4_;
  local_2c0._4_4_ = uVar77;
  local_2c0._0_4_ = uVar77;
  local_2c0._8_4_ = uVar77;
  local_2c0._12_4_ = uVar77;
  local_2c0._16_4_ = uVar77;
  local_2c0._20_4_ = uVar77;
  local_2c0._24_4_ = uVar77;
  local_2c0._28_4_ = uVar77;
  auVar245 = ZEXT3264(local_2c0);
  fVar76 = *(float *)(ray + k * 4 + 0x30);
  local_910 = ZEXT416((uint)local_360);
  local_360 = fVar76 - local_360;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_c48 = 1;
  uVar75 = 0;
  uVar77 = auVar9._0_4_;
  local_320._4_4_ = uVar77;
  local_320._0_4_ = uVar77;
  local_320._8_4_ = uVar77;
  local_320._12_4_ = uVar77;
  local_320._16_4_ = uVar77;
  local_320._20_4_ = uVar77;
  local_320._24_4_ = uVar77;
  local_320._28_4_ = uVar77;
  fVar111 = auVar81._0_4_;
  local_340._4_4_ = fVar111;
  local_340._0_4_ = fVar111;
  local_340._8_4_ = fVar111;
  local_340._12_4_ = fVar111;
  local_340._16_4_ = fVar111;
  local_340._20_4_ = fVar111;
  local_340._24_4_ = fVar111;
  local_340._28_4_ = fVar111;
  fVar112 = auVar82._0_4_;
  local_2e0 = fVar112;
  fStack_2dc = fVar112;
  fStack_2d8 = fVar112;
  fStack_2d4 = fVar112;
  fStack_2d0 = fVar112;
  fStack_2cc = fVar112;
  fStack_2c8 = fVar112;
  fStack_2c4 = fVar112;
  fVar113 = auVar8._0_4_;
  local_300 = fVar113;
  fStack_2fc = fVar113;
  fStack_2f8 = fVar113;
  fStack_2f4 = fVar113;
  fStack_2f0 = fVar113;
  fStack_2ec = fVar113;
  fStack_2e8 = fVar113;
  fStack_2e4 = fVar113;
  auVar97._4_4_ = uStack_89c;
  auVar97._0_4_ = local_8a0;
  auVar97._8_4_ = uStack_898;
  auVar97._12_4_ = uStack_894;
  auVar97._16_4_ = uStack_890;
  auVar97._20_4_ = uStack_88c;
  auVar97._24_4_ = uStack_888;
  auVar97._28_4_ = uStack_884;
  local_520 = vandps_avx(local_2c0,auVar97);
  auVar5 = vsqrtss_avx(local_9e0,local_9e0);
  auVar7 = vsqrtss_avx(local_9e0,local_9e0);
  local_550 = ZEXT816(0x3f80000000000000);
  local_500 = auVar273;
  uStack_75c = local_760;
  uStack_758 = local_760;
  uStack_754 = local_760;
  local_750 = uVar67;
  uStack_74c = uVar67;
  uStack_748 = uVar67;
  uStack_744 = uVar67;
  fStack_4b8 = local_4c0;
  fStack_4b4 = fStack_4bc;
  fStack_4b0 = local_4c0;
  fStack_4ac = fStack_4bc;
  fStack_4a8 = local_4c0;
  fStack_4a4 = fStack_4bc;
  fStack_498 = local_4a0;
  fStack_494 = fStack_49c;
  fStack_490 = local_4a0;
  fStack_48c = fStack_49c;
  fStack_488 = local_4a0;
  fStack_484 = fStack_49c;
  do {
    auVar173._8_4_ = 0x3f800000;
    auVar173._0_8_ = 0x3f8000003f800000;
    auVar173._12_4_ = 0x3f800000;
    auVar173._16_4_ = 0x3f800000;
    auVar173._20_4_ = 0x3f800000;
    iVar74 = (int)uVar75;
    auVar173._24_4_ = 0x3f800000;
    auVar173._28_4_ = 0x3f800000;
    auVar166 = vmovshdup_avx(local_550);
    auVar166 = vsubps_avx(auVar166,local_550);
    fVar141 = auVar166._0_4_;
    fVar145 = fVar141 * 0.04761905;
    local_7c0._0_4_ = local_550._0_4_;
    local_7c0._4_4_ = local_7c0._0_4_;
    local_7c0._8_4_ = local_7c0._0_4_;
    local_7c0._12_4_ = local_7c0._0_4_;
    local_7c0._16_4_ = local_7c0._0_4_;
    local_7c0._20_4_ = local_7c0._0_4_;
    local_7c0._24_4_ = local_7c0._0_4_;
    local_7c0._28_4_ = local_7c0._0_4_;
    local_7e0._4_4_ = fVar141;
    local_7e0._0_4_ = fVar141;
    local_7e0._8_4_ = fVar141;
    local_7e0._12_4_ = fVar141;
    local_7e0._16_4_ = fVar141;
    local_7e0._20_4_ = fVar141;
    local_7e0._24_4_ = fVar141;
    local_7e0._28_4_ = fVar141;
    auVar166 = vfmadd231ps_fma(local_7c0,local_7e0,_DAT_01faff20);
    auVar94 = vsubps_avx(auVar173,ZEXT1632(auVar166));
    fVar114 = auVar166._0_4_;
    auVar251._0_4_ = local_340._0_4_ * fVar114;
    fVar137 = auVar166._4_4_;
    auVar251._4_4_ = local_340._4_4_ * fVar137;
    fVar138 = auVar166._8_4_;
    auVar251._8_4_ = local_340._8_4_ * fVar138;
    fVar139 = auVar166._12_4_;
    auVar251._12_4_ = local_340._12_4_ * fVar139;
    auVar251._16_4_ = local_340._16_4_ * 0.0;
    auVar251._20_4_ = local_340._20_4_ * 0.0;
    auVar251._28_36_ = auVar250._28_36_;
    auVar251._24_4_ = local_340._24_4_ * 0.0;
    auVar63._8_8_ = uStack_1f8;
    auVar63._0_8_ = local_200;
    auVar63._16_8_ = uStack_1f0;
    auVar63._24_8_ = uStack_1e8;
    auVar250._0_4_ = (float)local_200 * fVar114;
    auVar250._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar137;
    auVar250._8_4_ = (float)uStack_1f8 * fVar138;
    auVar250._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar139;
    auVar250._16_4_ = (float)uStack_1f0 * 0.0;
    auVar250._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar250._28_36_ = auVar245._28_36_;
    auVar250._24_4_ = (float)uStack_1e8 * 0.0;
    auVar62._8_8_ = uStack_218;
    auVar62._0_8_ = local_220;
    auVar62._16_8_ = uStack_210;
    auVar62._24_8_ = uStack_208;
    auVar245._0_4_ = (float)local_220 * fVar114;
    auVar245._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar137;
    auVar245._8_4_ = (float)uStack_218 * fVar138;
    auVar245._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar139;
    auVar245._16_4_ = (float)uStack_210 * 0.0;
    auVar245._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar245._28_36_ = auVar241._28_36_;
    auVar245._24_4_ = (float)uStack_208 * 0.0;
    fVar143 = auVar6._0_4_;
    fVar140 = auVar6._4_4_;
    auVar153._4_4_ = fVar140 * fVar137;
    auVar153._0_4_ = fVar143 * fVar114;
    auVar153._8_4_ = fVar143 * fVar138;
    auVar153._12_4_ = fVar140 * fVar139;
    auVar153._16_4_ = fVar143 * 0.0;
    auVar153._20_4_ = fVar140 * 0.0;
    auVar153._24_4_ = fVar143 * 0.0;
    auVar153._28_4_ = fVar141;
    auVar166 = vfmadd231ps_fma(auVar251._0_32_,auVar94,local_320);
    auVar147 = vfmadd231ps_fma(auVar250._0_32_,auVar94,auVar273);
    auVar116 = vfmadd231ps_fma(auVar245._0_32_,auVar94,auVar271._0_32_);
    auVar64._8_8_ = uStack_1d8;
    auVar64._0_8_ = local_1e0;
    auVar64._16_8_ = uStack_1d0;
    auVar64._24_8_ = uStack_1c8;
    auVar80 = vfmadd231ps_fma(auVar153,auVar94,auVar64);
    auVar60._4_4_ = fStack_2dc;
    auVar60._0_4_ = local_2e0;
    auVar60._8_4_ = fStack_2d8;
    auVar60._12_4_ = fStack_2d4;
    auVar60._16_4_ = fStack_2d0;
    auVar60._20_4_ = fStack_2cc;
    auVar60._24_4_ = fStack_2c8;
    auVar60._28_4_ = fStack_2c4;
    auVar241._0_4_ = local_2e0 * fVar114;
    auVar241._4_4_ = fStack_2dc * fVar137;
    auVar241._8_4_ = fStack_2d8 * fVar138;
    auVar241._12_4_ = fStack_2d4 * fVar139;
    auVar241._16_4_ = fStack_2d0 * 0.0;
    auVar241._20_4_ = fStack_2cc * 0.0;
    auVar241._28_36_ = auVar238._28_36_;
    auVar241._24_4_ = fStack_2c8 * 0.0;
    auVar11._4_4_ = fVar137 * fStack_49c;
    auVar11._0_4_ = fVar114 * local_4a0;
    auVar11._8_4_ = fVar138 * fStack_498;
    auVar11._12_4_ = fVar139 * fStack_494;
    auVar11._16_4_ = fStack_490 * 0.0;
    auVar11._20_4_ = fStack_48c * 0.0;
    auVar11._24_4_ = fStack_488 * 0.0;
    auVar11._28_4_ = local_320._28_4_;
    auVar61._8_8_ = uStack_238;
    auVar61._0_8_ = local_240;
    auVar61._16_8_ = uStack_230;
    auVar61._24_8_ = uStack_228;
    auVar65._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar137;
    auVar65._0_4_ = (float)local_240 * fVar114;
    auVar65._8_4_ = (float)uStack_238 * fVar138;
    auVar65._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar139;
    auVar65._16_4_ = (float)uStack_230 * 0.0;
    auVar65._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar65._24_4_ = (float)uStack_228 * 0.0;
    auVar65._28_4_ = DAT_01faff20._28_4_;
    auVar178._4_4_ = fVar137 * fStack_4bc;
    auVar178._0_4_ = fVar114 * local_4c0;
    auVar178._8_4_ = fVar138 * fStack_4b8;
    auVar178._12_4_ = fVar139 * fStack_4b4;
    auVar178._16_4_ = fStack_4b0 * 0.0;
    auVar178._20_4_ = fStack_4ac * 0.0;
    uVar77 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    auVar178._24_4_ = fStack_4a8 * 0.0;
    auVar178._28_4_ = uVar77;
    auVar117 = vfmadd231ps_fma(auVar241._0_32_,auVar94,local_340);
    auVar88 = vfmadd231ps_fma(auVar11,auVar94,auVar63);
    auVar190 = vfmadd231ps_fma(auVar65,auVar94,auVar62);
    auVar79 = vfmadd231ps_fma(auVar178,auVar94,auVar227);
    auVar238._0_4_ = fVar114 * local_300;
    auVar238._4_4_ = fVar137 * fStack_2fc;
    auVar238._8_4_ = fVar138 * fStack_2f8;
    auVar238._12_4_ = fVar139 * fStack_2f4;
    auVar238._16_4_ = fStack_2f0 * 0.0;
    auVar238._20_4_ = fStack_2ec * 0.0;
    auVar238._28_36_ = auVar266._28_36_;
    auVar238._24_4_ = fStack_2e8 * 0.0;
    auVar12._4_4_ = fVar137 * local_260._4_4_;
    auVar12._0_4_ = fVar114 * (float)local_260;
    auVar12._8_4_ = fVar138 * (float)uStack_258;
    auVar12._12_4_ = fVar139 * uStack_258._4_4_;
    auVar12._16_4_ = (float)uStack_250 * 0.0;
    auVar12._20_4_ = uStack_250._4_4_ * 0.0;
    auVar12._24_4_ = (float)uStack_248 * 0.0;
    auVar12._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar66._28_4_ = fVar140;
    auVar66._0_28_ =
         ZEXT1628(CONCAT412(auVar117._12_4_ * fVar139,
                            CONCAT48(auVar117._8_4_ * fVar138,
                                     CONCAT44(auVar117._4_4_ * fVar137,auVar117._0_4_ * fVar114))));
    auVar166 = vfmadd231ps_fma(auVar66,auVar94,ZEXT1632(auVar166));
    auVar147 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar139 * auVar88._12_4_,
                                                  CONCAT48(fVar138 * auVar88._8_4_,
                                                           CONCAT44(fVar137 * auVar88._4_4_,
                                                                    fVar114 * auVar88._0_4_)))),
                               auVar94,ZEXT1632(auVar147));
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar139 * auVar190._12_4_,
                                                  CONCAT48(fVar138 * auVar190._8_4_,
                                                           CONCAT44(fVar137 * auVar190._4_4_,
                                                                    fVar114 * auVar190._0_4_)))),
                               auVar94,ZEXT1632(auVar116));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar139 * auVar79._12_4_,
                                                 CONCAT48(fVar138 * auVar79._8_4_,
                                                          CONCAT44(fVar137 * auVar79._4_4_,
                                                                   fVar114 * auVar79._0_4_)))),
                              auVar94,ZEXT1632(auVar80));
    auVar13._4_4_ = fVar137 * local_280._4_4_;
    auVar13._0_4_ = fVar114 * (float)local_280;
    auVar13._8_4_ = fVar138 * (float)uStack_278;
    auVar13._12_4_ = fVar139 * uStack_278._4_4_;
    auVar13._16_4_ = (float)uStack_270 * 0.0;
    auVar13._20_4_ = uStack_270._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_268 * 0.0;
    auVar13._28_4_ = local_340._28_4_;
    auVar115 = vfmadd231ps_fma(auVar238._0_32_,auVar94,auVar60);
    auVar117 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar115._12_4_ * fVar139,
                                                  CONCAT48(auVar115._8_4_ * fVar138,
                                                           CONCAT44(auVar115._4_4_ * fVar137,
                                                                    auVar115._0_4_ * fVar114)))),
                               auVar94,ZEXT1632(auVar117));
    auVar236._0_4_ = fVar114 * (float)local_2a0;
    auVar236._4_4_ = fVar137 * local_2a0._4_4_;
    auVar236._8_4_ = fVar138 * (float)uStack_298;
    auVar236._12_4_ = fVar139 * uStack_298._4_4_;
    auVar236._16_4_ = (float)uStack_290 * 0.0;
    auVar236._20_4_ = uStack_290._4_4_ * 0.0;
    auVar236._24_4_ = (float)uStack_288 * 0.0;
    auVar236._28_4_ = 0;
    auVar174._4_4_ = fStack_49c;
    auVar174._0_4_ = local_4a0;
    auVar174._8_4_ = fStack_498;
    auVar174._12_4_ = fStack_494;
    auVar174._16_4_ = fStack_490;
    auVar174._20_4_ = fStack_48c;
    auVar174._24_4_ = fStack_488;
    auVar174._28_4_ = fStack_484;
    auVar115 = vfmadd231ps_fma(auVar12,auVar94,auVar174);
    auVar189 = vfmadd231ps_fma(auVar13,auVar94,auVar61);
    auVar95._4_4_ = fStack_4bc;
    auVar95._0_4_ = local_4c0;
    auVar95._8_4_ = fStack_4b8;
    auVar95._12_4_ = fStack_4b4;
    auVar95._16_4_ = fStack_4b0;
    auVar95._20_4_ = fStack_4ac;
    auVar95._24_4_ = fStack_4a8;
    auVar95._28_4_ = fStack_4a4;
    auVar206 = vfmadd231ps_fma(auVar236,auVar94,auVar95);
    auVar177._28_4_ = uVar77;
    auVar177._0_28_ =
         ZEXT1628(CONCAT412(auVar206._12_4_ * fVar139,
                            CONCAT48(auVar206._8_4_ * fVar138,
                                     CONCAT44(auVar206._4_4_ * fVar137,auVar206._0_4_ * fVar114))));
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar115._12_4_ * fVar139,
                                                 CONCAT48(auVar115._8_4_ * fVar138,
                                                          CONCAT44(auVar115._4_4_ * fVar137,
                                                                   auVar115._0_4_ * fVar114)))),
                              auVar94,ZEXT1632(auVar88));
    auVar190 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar139 * auVar189._12_4_,
                                                  CONCAT48(fVar138 * auVar189._8_4_,
                                                           CONCAT44(fVar137 * auVar189._4_4_,
                                                                    fVar114 * auVar189._0_4_)))),
                               auVar94,ZEXT1632(auVar190));
    auVar79 = vfmadd231ps_fma(auVar177,auVar94,ZEXT1632(auVar79));
    auVar14._28_4_ = fStack_2c4;
    auVar14._0_28_ =
         ZEXT1628(CONCAT412(auVar88._12_4_ * fVar139,
                            CONCAT48(auVar88._8_4_ * fVar138,
                                     CONCAT44(auVar88._4_4_ * fVar137,auVar88._0_4_ * fVar114))));
    auVar15._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(fVar139 * auVar190._12_4_,
                            CONCAT48(fVar138 * auVar190._8_4_,
                                     CONCAT44(fVar137 * auVar190._4_4_,fVar114 * auVar190._0_4_))));
    auVar115 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar117._12_4_ * fVar139,
                                                  CONCAT48(auVar117._8_4_ * fVar138,
                                                           CONCAT44(auVar117._4_4_ * fVar137,
                                                                    auVar117._0_4_ * fVar114)))),
                               auVar94,ZEXT1632(auVar166));
    auVar189 = vfmadd231ps_fma(auVar14,auVar94,ZEXT1632(auVar147));
    auVar95 = ZEXT1632(auVar189);
    auVar189 = vfmadd231ps_fma(auVar15,auVar94,ZEXT1632(auVar116));
    auVar206 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar79._12_4_ * fVar139,
                                                  CONCAT48(auVar79._8_4_ * fVar138,
                                                           CONCAT44(auVar79._4_4_ * fVar137,
                                                                    auVar79._0_4_ * fVar114)))),
                               ZEXT1632(auVar80),auVar94);
    auVar273 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar166));
    auVar94 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar147));
    auVar97 = vsubps_avx(ZEXT1632(auVar190),ZEXT1632(auVar116));
    auVar153 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar80));
    local_aa0._0_4_ = fVar145 * auVar273._0_4_ * 3.0;
    local_aa0._4_4_ = fVar145 * auVar273._4_4_ * 3.0;
    local_aa0._8_4_ = fVar145 * auVar273._8_4_ * 3.0;
    local_aa0._12_4_ = fVar145 * auVar273._12_4_ * 3.0;
    local_aa0._16_4_ = fVar145 * auVar273._16_4_ * 3.0;
    local_aa0._20_4_ = fVar145 * auVar273._20_4_ * 3.0;
    local_aa0._24_4_ = fVar145 * auVar273._24_4_ * 3.0;
    local_aa0._28_4_ = 0;
    local_780._0_4_ = fVar145 * auVar94._0_4_ * 3.0;
    local_780._4_4_ = fVar145 * auVar94._4_4_ * 3.0;
    local_780._8_4_ = fVar145 * auVar94._8_4_ * 3.0;
    local_780._12_4_ = fVar145 * auVar94._12_4_ * 3.0;
    local_780._16_4_ = fVar145 * auVar94._16_4_ * 3.0;
    local_780._20_4_ = fVar145 * auVar94._20_4_ * 3.0;
    local_780._24_4_ = fVar145 * auVar94._24_4_ * 3.0;
    local_780._28_4_ = 0;
    auVar259._0_4_ = fVar145 * auVar97._0_4_ * 3.0;
    auVar259._4_4_ = fVar145 * auVar97._4_4_ * 3.0;
    auVar259._8_4_ = fVar145 * auVar97._8_4_ * 3.0;
    auVar259._12_4_ = fVar145 * auVar97._12_4_ * 3.0;
    auVar259._16_4_ = fVar145 * auVar97._16_4_ * 3.0;
    auVar259._20_4_ = fVar145 * auVar97._20_4_ * 3.0;
    auVar259._24_4_ = fVar145 * auVar97._24_4_ * 3.0;
    auVar259._28_4_ = 0;
    fVar114 = fVar145 * auVar153._0_4_ * 3.0;
    fVar137 = fVar145 * auVar153._4_4_ * 3.0;
    auVar98._4_4_ = fVar137;
    auVar98._0_4_ = fVar114;
    fVar138 = fVar145 * auVar153._8_4_ * 3.0;
    auVar98._8_4_ = fVar138;
    fVar139 = fVar145 * auVar153._12_4_ * 3.0;
    auVar98._12_4_ = fVar139;
    fVar141 = fVar145 * auVar153._16_4_ * 3.0;
    auVar98._16_4_ = fVar141;
    fVar143 = fVar145 * auVar153._20_4_ * 3.0;
    auVar98._20_4_ = fVar143;
    fVar145 = fVar145 * auVar153._24_4_ * 3.0;
    auVar98._24_4_ = fVar145;
    auVar98._28_4_ = auVar273._28_4_;
    auVar174 = ZEXT1632(auVar115);
    auVar12 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar115));
    auVar13 = vpermps_avx2(_DAT_01fec480,auVar95);
    _local_960 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar189));
    _local_6a0 = vsubps_avx(auVar12,auVar174);
    local_5e0 = vsubps_avx(_local_960,ZEXT1632(auVar189));
    fVar140 = local_5e0._0_4_;
    fVar142 = local_5e0._4_4_;
    auVar202._4_4_ = fVar142 * local_aa0._4_4_;
    auVar202._0_4_ = fVar140 * local_aa0._0_4_;
    fVar144 = local_5e0._8_4_;
    auVar202._8_4_ = fVar144 * local_aa0._8_4_;
    fVar146 = local_5e0._12_4_;
    auVar202._12_4_ = fVar146 * local_aa0._12_4_;
    fVar267 = local_5e0._16_4_;
    auVar202._16_4_ = fVar267 * local_aa0._16_4_;
    fVar233 = local_5e0._20_4_;
    auVar202._20_4_ = fVar233 * local_aa0._20_4_;
    fVar159 = local_5e0._24_4_;
    auVar202._24_4_ = fVar159 * local_aa0._24_4_;
    auVar202._28_4_ = auVar12._28_4_;
    auVar166 = vfmsub231ps_fma(auVar202,auVar259,_local_6a0);
    local_600 = vsubps_avx(auVar13,auVar95);
    fVar183 = local_6a0._0_4_;
    fVar184 = local_6a0._4_4_;
    auVar10._4_4_ = fVar184 * local_780._4_4_;
    auVar10._0_4_ = fVar183 * local_780._0_4_;
    fVar185 = local_6a0._8_4_;
    auVar10._8_4_ = fVar185 * local_780._8_4_;
    fVar186 = local_6a0._12_4_;
    auVar10._12_4_ = fVar186 * local_780._12_4_;
    fVar187 = local_6a0._16_4_;
    auVar10._16_4_ = fVar187 * local_780._16_4_;
    fVar188 = local_6a0._20_4_;
    auVar10._20_4_ = fVar188 * local_780._20_4_;
    fVar246 = local_6a0._24_4_;
    auVar10._24_4_ = fVar246 * local_780._24_4_;
    auVar10._28_4_ = auVar13._28_4_;
    auVar147 = vfmsub231ps_fma(auVar10,local_aa0,local_600);
    auVar166 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar147._12_4_ * auVar147._12_4_,
                                                  CONCAT48(auVar147._8_4_ * auVar147._8_4_,
                                                           CONCAT44(auVar147._4_4_ * auVar147._4_4_,
                                                                    auVar147._0_4_ * auVar147._0_4_)
                                                          ))),ZEXT1632(auVar166),ZEXT1632(auVar166))
    ;
    fVar247 = local_600._0_4_;
    fVar252 = local_600._4_4_;
    auVar17._4_4_ = fVar252 * auVar259._4_4_;
    auVar17._0_4_ = fVar247 * auVar259._0_4_;
    fVar253 = local_600._8_4_;
    auVar17._8_4_ = fVar253 * auVar259._8_4_;
    fVar254 = local_600._12_4_;
    auVar17._12_4_ = fVar254 * auVar259._12_4_;
    fVar255 = local_600._16_4_;
    auVar17._16_4_ = fVar255 * auVar259._16_4_;
    fVar256 = local_600._20_4_;
    auVar17._20_4_ = fVar256 * auVar259._20_4_;
    fVar257 = local_600._24_4_;
    auVar17._24_4_ = fVar257 * auVar259._24_4_;
    auVar17._28_4_ = local_960._28_4_;
    auVar116 = vfmsub231ps_fma(auVar17,local_780,local_5e0);
    auVar152._0_4_ = fVar140 * fVar140;
    auVar152._4_4_ = fVar142 * fVar142;
    auVar152._8_4_ = fVar144 * fVar144;
    auVar152._12_4_ = fVar146 * fVar146;
    auVar152._16_4_ = fVar267 * fVar267;
    auVar152._20_4_ = fVar233 * fVar233;
    auVar152._24_4_ = fVar159 * fVar159;
    auVar152._28_4_ = 0;
    auVar147 = vfmadd231ps_fma(auVar152,local_600,local_600);
    auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),_local_6a0,_local_6a0);
    auVar94 = vrcpps_avx(ZEXT1632(auVar147));
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT1632(auVar116),ZEXT1632(auVar116));
    auVar262._8_4_ = 0x3f800000;
    auVar262._0_8_ = 0x3f8000003f800000;
    auVar262._12_4_ = 0x3f800000;
    auVar262._16_4_ = 0x3f800000;
    auVar262._20_4_ = 0x3f800000;
    auVar262._24_4_ = 0x3f800000;
    auVar262._28_4_ = 0x3f800000;
    auVar166 = vfnmadd213ps_fma(auVar94,ZEXT1632(auVar147),auVar262);
    auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar94,auVar94);
    auVar177 = vpermps_avx2(_DAT_01fec480,local_aa0);
    local_a20 = vpermps_avx2(_DAT_01fec480,auVar259);
    auVar18._4_4_ = auVar177._4_4_ * fVar142;
    auVar18._0_4_ = auVar177._0_4_ * fVar140;
    auVar18._8_4_ = auVar177._8_4_ * fVar144;
    auVar18._12_4_ = auVar177._12_4_ * fVar146;
    auVar18._16_4_ = auVar177._16_4_ * fVar267;
    auVar18._20_4_ = auVar177._20_4_ * fVar233;
    auVar18._24_4_ = auVar177._24_4_ * fVar159;
    auVar18._28_4_ = auVar94._28_4_;
    auVar80 = vfmsub231ps_fma(auVar18,local_a20,_local_6a0);
    local_a40 = vpermps_avx2(_DAT_01fec480,local_780);
    auVar19._4_4_ = fVar184 * local_a40._4_4_;
    auVar19._0_4_ = fVar183 * local_a40._0_4_;
    auVar19._8_4_ = fVar185 * local_a40._8_4_;
    auVar19._12_4_ = fVar186 * local_a40._12_4_;
    auVar19._16_4_ = fVar187 * local_a40._16_4_;
    auVar19._20_4_ = fVar188 * local_a40._20_4_;
    auVar19._24_4_ = fVar246 * local_a40._24_4_;
    auVar19._28_4_ = 0;
    auVar117 = vfmsub231ps_fma(auVar19,auVar177,local_600);
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar117._12_4_ * auVar117._12_4_,
                                                 CONCAT48(auVar117._8_4_ * auVar117._8_4_,
                                                          CONCAT44(auVar117._4_4_ * auVar117._4_4_,
                                                                   auVar117._0_4_ * auVar117._0_4_))
                                                )),ZEXT1632(auVar80),ZEXT1632(auVar80));
    auVar214._0_4_ = fVar247 * local_a20._0_4_;
    auVar214._4_4_ = fVar252 * local_a20._4_4_;
    auVar214._8_4_ = fVar253 * local_a20._8_4_;
    auVar214._12_4_ = fVar254 * local_a20._12_4_;
    auVar214._16_4_ = fVar255 * local_a20._16_4_;
    auVar214._20_4_ = fVar256 * local_a20._20_4_;
    auVar214._24_4_ = fVar257 * local_a20._24_4_;
    auVar214._28_4_ = 0;
    auVar117 = vfmsub231ps_fma(auVar214,local_a40,local_5e0);
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar117),ZEXT1632(auVar117));
    auVar94 = vmaxps_avx(ZEXT1632(CONCAT412(auVar116._12_4_ * auVar166._12_4_,
                                            CONCAT48(auVar116._8_4_ * auVar166._8_4_,
                                                     CONCAT44(auVar116._4_4_ * auVar166._4_4_,
                                                              auVar116._0_4_ * auVar166._0_4_)))),
                         ZEXT1632(CONCAT412(auVar80._12_4_ * auVar166._12_4_,
                                            CONCAT48(auVar80._8_4_ * auVar166._8_4_,
                                                     CONCAT44(auVar80._4_4_ * auVar166._4_4_,
                                                              auVar80._0_4_ * auVar166._0_4_)))));
    auVar175._0_4_ = auVar206._0_4_ + fVar114;
    auVar175._4_4_ = auVar206._4_4_ + fVar137;
    auVar175._8_4_ = auVar206._8_4_ + fVar138;
    auVar175._12_4_ = auVar206._12_4_ + fVar139;
    auVar175._16_4_ = fVar141 + 0.0;
    auVar175._20_4_ = fVar143 + 0.0;
    auVar175._24_4_ = fVar145 + 0.0;
    auVar175._28_4_ = auVar273._28_4_ + 0.0;
    auStack_810 = auVar175._16_16_;
    local_800 = ZEXT1632(auVar206);
    auVar273 = vsubps_avx(local_800,auVar98);
    auVar14 = vpermps_avx2(_DAT_01fec480,auVar273);
    auVar15 = vpermps_avx2(_DAT_01fec480,local_800);
    auVar273 = vmaxps_avx(local_800,auVar175);
    auVar97 = vmaxps_avx(auVar14,auVar15);
    auVar153 = vrsqrtps_avx(ZEXT1632(auVar147));
    auVar273 = vmaxps_avx(auVar273,auVar97);
    fVar114 = auVar153._0_4_;
    fVar137 = auVar153._4_4_;
    fVar138 = auVar153._8_4_;
    fVar139 = auVar153._12_4_;
    fVar145 = auVar153._16_4_;
    fVar141 = auVar153._20_4_;
    fVar143 = auVar153._24_4_;
    auVar20._4_4_ = fVar137 * fVar137 * fVar137 * auVar147._4_4_ * -0.5;
    auVar20._0_4_ = fVar114 * fVar114 * fVar114 * auVar147._0_4_ * -0.5;
    auVar20._8_4_ = fVar138 * fVar138 * fVar138 * auVar147._8_4_ * -0.5;
    auVar20._12_4_ = fVar139 * fVar139 * fVar139 * auVar147._12_4_ * -0.5;
    auVar20._16_4_ = fVar145 * fVar145 * fVar145 * -0.0;
    auVar20._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
    auVar20._24_4_ = fVar143 * fVar143 * fVar143 * -0.0;
    auVar20._28_4_ = auVar97._28_4_;
    auVar96._8_4_ = 0x3fc00000;
    auVar96._0_8_ = 0x3fc000003fc00000;
    auVar96._12_4_ = 0x3fc00000;
    auVar96._16_4_ = 0x3fc00000;
    auVar96._20_4_ = 0x3fc00000;
    auVar96._24_4_ = 0x3fc00000;
    auVar96._28_4_ = 0x3fc00000;
    auVar166 = vfmadd231ps_fma(auVar20,auVar96,auVar153);
    fVar137 = auVar166._0_4_;
    fVar138 = auVar166._4_4_;
    auVar21._4_4_ = fVar252 * fVar138;
    auVar21._0_4_ = fVar247 * fVar137;
    fVar145 = auVar166._8_4_;
    auVar21._8_4_ = fVar253 * fVar145;
    fVar143 = auVar166._12_4_;
    auVar21._12_4_ = fVar254 * fVar143;
    auVar21._16_4_ = fVar255 * 0.0;
    auVar21._20_4_ = fVar256 * 0.0;
    uVar77 = auVar153._28_4_;
    auVar21._24_4_ = fVar257 * 0.0;
    auVar21._28_4_ = uVar77;
    auVar22._4_4_ = (float)local_9c0._4_4_ * fVar142 * fVar138;
    auVar22._0_4_ = (float)local_9c0._0_4_ * fVar140 * fVar137;
    auVar22._8_4_ = fStack_9b8 * fVar144 * fVar145;
    auVar22._12_4_ = fStack_9b4 * fVar146 * fVar143;
    auVar22._16_4_ = fStack_9b0 * fVar267 * 0.0;
    auVar22._20_4_ = fStack_9ac * fVar233 * 0.0;
    auVar22._24_4_ = fStack_9a8 * fVar159 * 0.0;
    auVar22._28_4_ = local_600._28_4_;
    auVar147 = vfmadd231ps_fma(auVar22,auVar21,_local_840);
    local_5c0 = ZEXT1632(auVar189);
    auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
    local_7a0 = vsubps_avx(auVar97,local_5c0);
    fVar247 = local_7a0._0_4_;
    auVar274._0_4_ = fVar247 * fVar140 * fVar137;
    fVar252 = local_7a0._4_4_;
    auVar274._4_4_ = fVar252 * fVar142 * fVar138;
    fVar253 = local_7a0._8_4_;
    auVar274._8_4_ = fVar253 * fVar144 * fVar145;
    fVar254 = local_7a0._12_4_;
    auVar274._12_4_ = fVar254 * fVar146 * fVar143;
    fVar255 = local_7a0._16_4_;
    auVar274._16_4_ = fVar255 * fVar267 * 0.0;
    fVar256 = local_7a0._20_4_;
    auVar274._20_4_ = fVar256 * fVar233 * 0.0;
    fVar257 = local_7a0._24_4_;
    auVar274._24_4_ = fVar257 * fVar159 * 0.0;
    auVar274._28_4_ = 0;
    auVar97 = vsubps_avx(auVar97,auVar95);
    auVar116 = vfmadd231ps_fma(auVar274,auVar97,auVar21);
    auVar23._4_4_ = fVar184 * fVar138;
    auVar23._0_4_ = fVar183 * fVar137;
    auVar23._8_4_ = fVar185 * fVar145;
    auVar23._12_4_ = fVar186 * fVar143;
    auVar23._16_4_ = fVar187 * 0.0;
    auVar23._20_4_ = fVar188 * 0.0;
    auVar23._24_4_ = fVar246 * 0.0;
    auVar23._28_4_ = uVar77;
    auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar23,_local_860);
    auVar250 = ZEXT1664(auVar147);
    auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar153 = vsubps_avx(auVar98,auVar174);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar153,auVar23);
    auVar24._4_4_ = fVar252 * (float)local_9c0._4_4_;
    auVar24._0_4_ = fVar247 * (float)local_9c0._0_4_;
    auVar24._8_4_ = fVar253 * fStack_9b8;
    auVar24._12_4_ = fVar254 * fStack_9b4;
    auVar24._16_4_ = fVar255 * fStack_9b0;
    auVar24._20_4_ = fVar256 * fStack_9ac;
    auVar24._24_4_ = fVar257 * fStack_9a8;
    auVar24._28_4_ = uVar77;
    auVar80 = vfmadd231ps_fma(auVar24,_local_840,auVar97);
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),_local_860,auVar153);
    fVar114 = auVar116._0_4_;
    fVar267 = auVar147._0_4_;
    fVar139 = auVar116._4_4_;
    fVar233 = auVar147._4_4_;
    fVar141 = auVar116._8_4_;
    fVar159 = auVar147._8_4_;
    fVar140 = auVar116._12_4_;
    fVar183 = auVar147._12_4_;
    auVar25._28_4_ = uStack_9a4;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar183 * fVar140,
                            CONCAT48(fVar159 * fVar141,CONCAT44(fVar233 * fVar139,fVar267 * fVar114)
                                    )));
    auVar11 = vsubps_avx(ZEXT1632(auVar80),auVar25);
    auVar26._4_4_ = fVar252 * fVar252;
    auVar26._0_4_ = fVar247 * fVar247;
    auVar26._8_4_ = fVar253 * fVar253;
    auVar26._12_4_ = fVar254 * fVar254;
    auVar26._16_4_ = fVar255 * fVar255;
    auVar26._20_4_ = fVar256 * fVar256;
    auVar26._24_4_ = fVar257 * fVar257;
    auVar26._28_4_ = uStack_9a4;
    auVar80 = vfmadd231ps_fma(auVar26,auVar97,auVar97);
    auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar153,auVar153);
    auVar27._28_4_ = local_6a0._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar140 * fVar140,
                            CONCAT48(fVar141 * fVar141,CONCAT44(fVar139 * fVar139,fVar114 * fVar114)
                                    )));
    auVar178 = vsubps_avx(ZEXT1632(auVar80),auVar27);
    _local_680 = vsqrtps_avx(auVar94);
    fVar114 = (local_680._0_4_ + auVar273._0_4_) * 1.0000002;
    fVar139 = (local_680._4_4_ + auVar273._4_4_) * 1.0000002;
    fVar141 = (local_680._8_4_ + auVar273._8_4_) * 1.0000002;
    fVar140 = (local_680._12_4_ + auVar273._12_4_) * 1.0000002;
    fVar142 = (local_680._16_4_ + auVar273._16_4_) * 1.0000002;
    fVar144 = (local_680._20_4_ + auVar273._20_4_) * 1.0000002;
    fVar146 = (local_680._24_4_ + auVar273._24_4_) * 1.0000002;
    auVar28._4_4_ = fVar139 * fVar139;
    auVar28._0_4_ = fVar114 * fVar114;
    auVar28._8_4_ = fVar141 * fVar141;
    auVar28._12_4_ = fVar140 * fVar140;
    auVar28._16_4_ = fVar142 * fVar142;
    auVar28._20_4_ = fVar144 * fVar144;
    auVar28._24_4_ = fVar146 * fVar146;
    auVar28._28_4_ = local_680._28_4_ + auVar273._28_4_;
    local_640._0_4_ = auVar11._0_4_ + auVar11._0_4_;
    local_640._4_4_ = auVar11._4_4_ + auVar11._4_4_;
    local_640._8_4_ = auVar11._8_4_ + auVar11._8_4_;
    local_640._12_4_ = auVar11._12_4_ + auVar11._12_4_;
    local_640._16_4_ = auVar11._16_4_ + auVar11._16_4_;
    local_640._20_4_ = auVar11._20_4_ + auVar11._20_4_;
    local_640._24_4_ = auVar11._24_4_ + auVar11._24_4_;
    local_640._28_4_ = auVar11._28_4_ + auVar11._28_4_;
    auVar241 = ZEXT3264(local_640);
    auVar273 = vsubps_avx(auVar178,auVar28);
    auVar245 = ZEXT3264(auVar273);
    local_3c0 = ZEXT1632(auVar147);
    local_620._28_4_ = local_7a0._28_4_;
    local_620._0_28_ =
         ZEXT1628(CONCAT412(fVar183 * fVar183,
                            CONCAT48(fVar159 * fVar159,CONCAT44(fVar233 * fVar233,fVar267 * fVar267)
                                    )));
    local_540 = vsubps_avx(local_2c0,local_620);
    auVar238 = ZEXT3264(local_540);
    auVar29._4_4_ = local_640._4_4_ * local_640._4_4_;
    auVar29._0_4_ = local_640._0_4_ * local_640._0_4_;
    auVar29._8_4_ = local_640._8_4_ * local_640._8_4_;
    auVar29._12_4_ = local_640._12_4_ * local_640._12_4_;
    auVar29._16_4_ = local_640._16_4_ * local_640._16_4_;
    auVar29._20_4_ = local_640._20_4_ * local_640._20_4_;
    auVar29._24_4_ = local_640._24_4_ * local_640._24_4_;
    auVar29._28_4_ = 0x3f800002;
    fVar139 = local_540._0_4_;
    fVar141 = local_540._4_4_;
    fVar140 = local_540._8_4_;
    fStack_998 = fVar140 * 4.0;
    fVar142 = local_540._12_4_;
    fStack_994 = fVar142 * 4.0;
    fVar144 = local_540._16_4_;
    fStack_990 = fVar144 * 4.0;
    fVar146 = local_540._20_4_;
    fStack_98c = fVar146 * 4.0;
    fVar267 = local_540._24_4_;
    fStack_988 = fVar267 * 4.0;
    uStack_984 = 0x40800000;
    auVar30._4_4_ = auVar273._4_4_ * fVar141 * 4.0;
    auVar30._0_4_ = auVar273._0_4_ * fVar139 * 4.0;
    auVar30._8_4_ = auVar273._8_4_ * fStack_998;
    auVar30._12_4_ = auVar273._12_4_ * fStack_994;
    auVar30._16_4_ = auVar273._16_4_ * fStack_990;
    auVar30._20_4_ = auVar273._20_4_ * fStack_98c;
    auVar30._24_4_ = auVar273._24_4_ * fStack_988;
    auVar30._28_4_ = 0x40800000;
    auVar11 = vsubps_avx(auVar29,auVar30);
    auVar94 = vcmpps_avx(auVar11,auVar98,5);
    local_3e0 = ZEXT1632(auVar116);
    fVar114 = local_540._28_4_;
    if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar94 >> 0x7f,0) == '\0') &&
          (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar94 >> 0xbf,0) == '\0') &&
        (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar94[0x1f]) {
      auVar263._8_4_ = 0x7f800000;
      auVar263._0_8_ = 0x7f8000007f800000;
      auVar263._12_4_ = 0x7f800000;
      auVar263._16_4_ = 0x7f800000;
      auVar263._20_4_ = 0x7f800000;
      auVar263._24_4_ = 0x7f800000;
      auVar263._28_4_ = 0x7f800000;
      auVar198._8_4_ = 0xff800000;
      auVar198._0_8_ = 0xff800000ff800000;
      auVar198._12_4_ = 0xff800000;
      auVar198._16_4_ = 0xff800000;
      auVar198._20_4_ = 0xff800000;
      auVar198._24_4_ = 0xff800000;
      auVar198._28_4_ = 0xff800000;
    }
    else {
      auVar10 = vsqrtps_avx(auVar11);
      auVar99._0_4_ = fVar139 + fVar139;
      auVar99._4_4_ = fVar141 + fVar141;
      auVar99._8_4_ = fVar140 + fVar140;
      auVar99._12_4_ = fVar142 + fVar142;
      auVar99._16_4_ = fVar144 + fVar144;
      auVar99._20_4_ = fVar146 + fVar146;
      auVar99._24_4_ = fVar267 + fVar267;
      auVar99._28_4_ = fVar114 + fVar114;
      auVar202 = vrcpps_avx(auVar99);
      auVar98 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
      auVar199._8_4_ = 0x3f800000;
      auVar199._0_8_ = 0x3f8000003f800000;
      auVar199._12_4_ = 0x3f800000;
      auVar199._16_4_ = 0x3f800000;
      auVar199._20_4_ = 0x3f800000;
      auVar199._24_4_ = 0x3f800000;
      auVar199._28_4_ = 0x3f800000;
      auVar147 = vfnmadd213ps_fma(auVar99,auVar202,auVar199);
      auVar147 = vfmadd132ps_fma(ZEXT1632(auVar147),auVar202,auVar202);
      auVar200._0_4_ = (uint)local_640._0_4_ ^ local_660;
      auVar200._4_4_ = (uint)local_640._4_4_ ^ uStack_65c;
      auVar200._8_4_ = (uint)local_640._8_4_ ^ uStack_658;
      auVar200._12_4_ = (uint)local_640._12_4_ ^ uStack_654;
      auVar200._16_4_ = (uint)local_640._16_4_ ^ (uint)fStack_650;
      auVar200._20_4_ = (uint)local_640._20_4_ ^ (uint)fStack_64c;
      auVar200._24_4_ = (uint)local_640._24_4_ ^ (uint)fStack_648;
      auVar200._28_4_ = (uint)local_640._28_4_ ^ uStack_644;
      auVar202 = vsubps_avx(auVar200,auVar10);
      auVar31._4_4_ = auVar202._4_4_ * auVar147._4_4_;
      auVar31._0_4_ = auVar202._0_4_ * auVar147._0_4_;
      auVar31._8_4_ = auVar202._8_4_ * auVar147._8_4_;
      auVar31._12_4_ = auVar202._12_4_ * auVar147._12_4_;
      auVar31._16_4_ = auVar202._16_4_ * 0.0;
      auVar31._20_4_ = auVar202._20_4_ * 0.0;
      auVar31._24_4_ = auVar202._24_4_ * 0.0;
      auVar31._28_4_ = auVar202._28_4_;
      auVar11 = vsubps_avx(auVar10,local_640);
      auVar100._0_4_ = auVar11._0_4_ * auVar147._0_4_;
      auVar100._4_4_ = auVar11._4_4_ * auVar147._4_4_;
      auVar100._8_4_ = auVar11._8_4_ * auVar147._8_4_;
      auVar100._12_4_ = auVar11._12_4_ * auVar147._12_4_;
      auVar100._16_4_ = auVar11._16_4_ * 0.0;
      auVar100._20_4_ = auVar11._20_4_ * 0.0;
      auVar100._24_4_ = auVar11._24_4_ * 0.0;
      auVar100._28_4_ = 0;
      auVar147 = vfmadd213ps_fma(local_3c0,auVar31,local_3e0);
      local_380 = ZEXT1632(CONCAT412(fVar143 * auVar147._12_4_,
                                     CONCAT48(fVar145 * auVar147._8_4_,
                                              CONCAT44(fVar138 * auVar147._4_4_,
                                                       fVar137 * auVar147._0_4_))));
      auVar53._4_4_ = uStack_89c;
      auVar53._0_4_ = local_8a0;
      auVar53._8_4_ = uStack_898;
      auVar53._12_4_ = uStack_894;
      auVar53._16_4_ = uStack_890;
      auVar53._20_4_ = uStack_88c;
      auVar53._24_4_ = uStack_888;
      auVar53._28_4_ = uStack_884;
      auVar11 = vandps_avx(local_620,auVar53);
      auVar11 = vmaxps_avx(local_520,auVar11);
      auVar32._4_4_ = auVar11._4_4_ * 1.9073486e-06;
      auVar32._0_4_ = auVar11._0_4_ * 1.9073486e-06;
      auVar32._8_4_ = auVar11._8_4_ * 1.9073486e-06;
      auVar32._12_4_ = auVar11._12_4_ * 1.9073486e-06;
      auVar32._16_4_ = auVar11._16_4_ * 1.9073486e-06;
      auVar32._20_4_ = auVar11._20_4_ * 1.9073486e-06;
      auVar32._24_4_ = auVar11._24_4_ * 1.9073486e-06;
      auVar32._28_4_ = auVar11._28_4_;
      auVar11 = vandps_avx(local_540,auVar53);
      auVar11 = vcmpps_avx(auVar11,auVar32,1);
      auVar147 = vfmadd213ps_fma(local_3c0,auVar100,local_3e0);
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar263 = vblendvps_avx(auVar228,auVar31,auVar98);
      local_3a0 = auVar147._0_4_ * fVar137;
      fStack_39c = auVar147._4_4_ * fVar138;
      fStack_398 = auVar147._8_4_ * fVar145;
      fStack_394 = auVar147._12_4_ * fVar143;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = auVar202._28_4_;
      auVar201._8_4_ = 0xff800000;
      auVar201._0_8_ = 0xff800000ff800000;
      auVar201._12_4_ = 0xff800000;
      auVar201._16_4_ = 0xff800000;
      auVar201._20_4_ = 0xff800000;
      auVar201._24_4_ = 0xff800000;
      auVar201._28_4_ = 0xff800000;
      auVar198 = vblendvps_avx(auVar201,auVar100,auVar98);
      auVar202 = auVar98 & auVar11;
      if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar202 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar202 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar202 >> 0x7f,0) != '\0') ||
            (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar202 >> 0xbf,0) != '\0') ||
          (auVar202 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar202[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar11,auVar98);
        auVar11 = vcmpps_avx(auVar273,ZEXT832(0) << 0x20,2);
        auVar270._8_4_ = 0xff800000;
        auVar270._0_8_ = 0xff800000ff800000;
        auVar270._12_4_ = 0xff800000;
        auVar270._16_4_ = 0xff800000;
        auVar270._20_4_ = 0xff800000;
        auVar270._24_4_ = 0xff800000;
        auVar270._28_4_ = 0xff800000;
        auVar232._8_4_ = 0x7f800000;
        auVar232._0_8_ = 0x7f8000007f800000;
        auVar232._12_4_ = 0x7f800000;
        auVar232._16_4_ = 0x7f800000;
        auVar232._20_4_ = 0x7f800000;
        auVar232._24_4_ = 0x7f800000;
        auVar232._28_4_ = 0x7f800000;
        auVar273 = vblendvps_avx(auVar232,auVar270,auVar11);
        auVar147 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
        auVar202 = vpmovsxwd_avx2(auVar147);
        auVar263 = vblendvps_avx(auVar263,auVar273,auVar202);
        auVar273 = vblendvps_avx(auVar270,auVar232,auVar11);
        auVar245 = ZEXT3264(auVar273);
        auVar198 = vblendvps_avx(auVar198,auVar273,auVar202);
        auVar109._0_8_ = auVar94._0_8_ ^ 0xffffffffffffffff;
        auVar109._8_4_ = auVar94._8_4_ ^ 0xffffffff;
        auVar109._12_4_ = auVar94._12_4_ ^ 0xffffffff;
        auVar109._16_4_ = auVar94._16_4_ ^ 0xffffffff;
        auVar109._20_4_ = auVar94._20_4_ ^ 0xffffffff;
        auVar109._24_4_ = auVar94._24_4_ ^ 0xffffffff;
        auVar109._28_4_ = auVar94._28_4_ ^ 0xffffffff;
        auVar94 = vorps_avx(auVar11,auVar109);
        auVar94 = vandps_avx(auVar98,auVar94);
      }
    }
    auVar266 = ZEXT3264(auVar263);
    auVar273 = local_4e0 & auVar94;
    if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar273 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar273 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar273 >> 0x7f,0) == '\0') &&
          (auVar273 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar273 >> 0xbf,0) == '\0') &&
        (auVar273 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar273[0x1f])
    {
      auVar271 = ZEXT3264(local_a80);
    }
    else {
      local_400 = ZEXT1632(auVar166);
      fVar233 = *(float *)(ray + k * 4 + 0x80);
      local_570 = ZEXT416((uint)fVar233);
      fVar159 = fVar233 - (float)local_910._0_4_;
      auVar101._4_4_ = fVar159;
      auVar101._0_4_ = fVar159;
      auVar101._8_4_ = fVar159;
      auVar101._12_4_ = fVar159;
      auVar101._16_4_ = fVar159;
      auVar101._20_4_ = fVar159;
      auVar101._24_4_ = fVar159;
      auVar101._28_4_ = fVar159;
      auVar98 = vminps_avx(auVar101,auVar198);
      auVar176._0_4_ = auVar259._0_4_ * fVar247;
      auVar176._4_4_ = auVar259._4_4_ * fVar252;
      auVar176._8_4_ = auVar259._8_4_ * fVar253;
      auVar176._12_4_ = auVar259._12_4_ * fVar254;
      auVar176._16_4_ = auVar259._16_4_ * fVar255;
      auVar176._20_4_ = auVar259._20_4_ * fVar256;
      auVar176._24_4_ = auVar259._24_4_ * fVar257;
      auVar176._28_4_ = 0;
      auVar166 = vfmadd213ps_fma(auVar97,local_780,auVar176);
      auVar59._4_4_ = fStack_35c;
      auVar59._0_4_ = local_360;
      auVar59._8_4_ = fStack_358;
      auVar59._12_4_ = fStack_354;
      auVar59._16_4_ = fStack_350;
      auVar59._20_4_ = fStack_34c;
      auVar59._24_4_ = fStack_348;
      auVar59._28_4_ = fStack_344;
      auVar11 = vmaxps_avx(auVar59,auVar263);
      auVar147 = vfmadd213ps_fma(auVar153,local_aa0,ZEXT1632(auVar166));
      auVar241 = ZEXT3264(_local_9c0);
      auVar33._4_4_ = (float)local_9c0._4_4_ * auVar259._4_4_;
      auVar33._0_4_ = (float)local_9c0._0_4_ * auVar259._0_4_;
      auVar33._8_4_ = fStack_9b8 * auVar259._8_4_;
      auVar33._12_4_ = fStack_9b4 * auVar259._12_4_;
      auVar33._16_4_ = fStack_9b0 * auVar259._16_4_;
      auVar33._20_4_ = fStack_9ac * auVar259._20_4_;
      auVar33._24_4_ = fStack_9a8 * auVar259._24_4_;
      auVar33._28_4_ = 0;
      auVar238 = ZEXT3264(_local_840);
      auVar166 = vfmadd231ps_fma(auVar33,_local_840,local_780);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar166),_local_860,local_aa0);
      auVar54._4_4_ = uStack_89c;
      auVar54._0_4_ = local_8a0;
      auVar54._8_4_ = uStack_898;
      auVar54._12_4_ = uStack_894;
      auVar54._16_4_ = uStack_890;
      auVar54._20_4_ = uStack_88c;
      auVar54._24_4_ = uStack_888;
      auVar54._28_4_ = uStack_884;
      auVar273 = vandps_avx(auVar54,ZEXT1632(auVar116));
      auVar229._8_4_ = 0x219392ef;
      auVar229._0_8_ = 0x219392ef219392ef;
      auVar229._12_4_ = 0x219392ef;
      auVar229._16_4_ = 0x219392ef;
      auVar229._20_4_ = 0x219392ef;
      auVar229._24_4_ = 0x219392ef;
      auVar229._28_4_ = 0x219392ef;
      auVar97 = vcmpps_avx(auVar273,auVar229,1);
      auVar273 = vrcpps_avx(ZEXT1632(auVar116));
      auVar230._8_4_ = 0x3f800000;
      auVar230._0_8_ = 0x3f8000003f800000;
      auVar230._12_4_ = 0x3f800000;
      auVar230._16_4_ = 0x3f800000;
      auVar230._20_4_ = 0x3f800000;
      auVar230._24_4_ = 0x3f800000;
      auVar230._28_4_ = 0x3f800000;
      auVar202 = ZEXT1632(auVar116);
      auVar166 = vfnmadd213ps_fma(auVar273,auVar202,auVar230);
      auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar273,auVar273);
      auVar260._0_4_ = auVar116._0_4_ ^ local_660;
      auVar260._4_4_ = auVar116._4_4_ ^ uStack_65c;
      auVar260._8_4_ = auVar116._8_4_ ^ uStack_658;
      auVar260._12_4_ = auVar116._12_4_ ^ uStack_654;
      auVar260._16_4_ = fStack_650;
      auVar260._20_4_ = fStack_64c;
      auVar260._24_4_ = fStack_648;
      auVar260._28_4_ = uStack_644;
      auVar34._4_4_ = auVar166._4_4_ * (float)(auVar147._4_4_ ^ uStack_65c);
      auVar34._0_4_ = auVar166._0_4_ * (float)(auVar147._0_4_ ^ local_660);
      auVar34._8_4_ = auVar166._8_4_ * (float)(auVar147._8_4_ ^ uStack_658);
      auVar34._12_4_ = auVar166._12_4_ * (float)(auVar147._12_4_ ^ uStack_654);
      auVar34._16_4_ = fStack_650 * 0.0;
      auVar34._20_4_ = fStack_64c * 0.0;
      auVar34._24_4_ = fStack_648 * 0.0;
      auVar34._28_4_ = uStack_644;
      auVar273 = vcmpps_avx(auVar202,auVar260,1);
      auVar273 = vorps_avx(auVar97,auVar273);
      auVar264._8_4_ = 0xff800000;
      auVar264._0_8_ = 0xff800000ff800000;
      auVar264._12_4_ = 0xff800000;
      auVar264._16_4_ = 0xff800000;
      auVar264._20_4_ = 0xff800000;
      auVar264._24_4_ = 0xff800000;
      auVar264._28_4_ = 0xff800000;
      auVar266 = ZEXT3264(auVar264);
      auVar273 = vblendvps_avx(auVar34,auVar264,auVar273);
      auVar153 = vmaxps_avx(auVar11,auVar273);
      auVar273 = vcmpps_avx(auVar202,auVar260,6);
      auVar273 = vorps_avx(auVar97,auVar273);
      auVar203._8_4_ = 0x7f800000;
      auVar203._0_8_ = 0x7f8000007f800000;
      auVar203._12_4_ = 0x7f800000;
      auVar203._16_4_ = 0x7f800000;
      auVar203._20_4_ = 0x7f800000;
      auVar203._24_4_ = 0x7f800000;
      auVar203._28_4_ = 0x7f800000;
      auVar273 = vblendvps_avx(auVar34,auVar203,auVar273);
      auVar11 = vminps_avx(auVar98,auVar273);
      fVar159 = (float)(local_660 ^ (uint)local_a20._0_4_);
      fVar183 = (float)(uStack_65c ^ (uint)local_a20._4_4_);
      fVar184 = (float)(uStack_658 ^ (uint)local_a20._8_4_);
      fVar185 = (float)(uStack_654 ^ (uint)local_a20._12_4_);
      fVar186 = (float)((uint)fStack_650 ^ (uint)local_a20._16_4_);
      fVar187 = (float)((uint)fStack_64c ^ (uint)local_a20._20_4_);
      fVar188 = (float)((uint)fStack_648 ^ (uint)local_a20._24_4_);
      auVar204._0_4_ = local_660 ^ (uint)local_a40._0_4_;
      auVar204._4_4_ = uStack_65c ^ (uint)local_a40._4_4_;
      auVar204._8_4_ = uStack_658 ^ (uint)local_a40._8_4_;
      auVar204._12_4_ = uStack_654 ^ (uint)local_a40._12_4_;
      auVar204._16_4_ = (uint)fStack_650 ^ (uint)local_a40._16_4_;
      auVar204._20_4_ = (uint)fStack_64c ^ (uint)local_a40._20_4_;
      auVar204._24_4_ = (uint)fStack_648 ^ (uint)local_a40._24_4_;
      auVar204._28_4_ = uStack_644 ^ local_a40._28_4_;
      auVar250 = ZEXT864(0) << 0x20;
      auVar273 = vsubps_avx(ZEXT832(0) << 0x20,auVar13);
      auVar97 = vsubps_avx(ZEXT832(0) << 0x20,_local_960);
      auVar35._4_4_ = auVar97._4_4_ * fVar183;
      auVar35._0_4_ = auVar97._0_4_ * fVar159;
      auVar35._8_4_ = auVar97._8_4_ * fVar184;
      auVar35._12_4_ = auVar97._12_4_ * fVar185;
      auVar35._16_4_ = auVar97._16_4_ * fVar186;
      auVar35._20_4_ = auVar97._20_4_ * fVar187;
      auVar35._24_4_ = auVar97._24_4_ * fVar188;
      auVar35._28_4_ = auVar97._28_4_;
      auVar166 = vfmadd231ps_fma(auVar35,auVar204,auVar273);
      uStack_b64 = auVar177._28_4_;
      auVar215._0_4_ = local_660 ^ (uint)auVar177._0_4_;
      auVar215._4_4_ = uStack_65c ^ (uint)auVar177._4_4_;
      auVar215._8_4_ = uStack_658 ^ (uint)auVar177._8_4_;
      auVar215._12_4_ = uStack_654 ^ (uint)auVar177._12_4_;
      auVar215._16_4_ = (uint)fStack_650 ^ (uint)auVar177._16_4_;
      auVar215._20_4_ = (uint)fStack_64c ^ (uint)auVar177._20_4_;
      auVar215._24_4_ = (uint)fStack_648 ^ (uint)auVar177._24_4_;
      auVar215._28_4_ = uStack_644 ^ uStack_b64;
      auVar273 = vsubps_avx(ZEXT832(0) << 0x20,auVar12);
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar166),auVar215,auVar273);
      auVar36._4_4_ = (float)local_9c0._4_4_ * fVar183;
      auVar36._0_4_ = (float)local_9c0._0_4_ * fVar159;
      auVar36._8_4_ = fStack_9b8 * fVar184;
      auVar36._12_4_ = fStack_9b4 * fVar185;
      auVar36._16_4_ = fStack_9b0 * fVar186;
      auVar36._20_4_ = fStack_9ac * fVar187;
      auVar36._24_4_ = fStack_9a8 * fVar188;
      auVar36._28_4_ = uStack_644 ^ local_a20._28_4_;
      auVar166 = vfmadd231ps_fma(auVar36,_local_840,auVar204);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar166),_local_860,auVar215);
      auVar273 = vandps_avx(auVar54,ZEXT1632(auVar116));
      auVar12 = vrcpps_avx(ZEXT1632(auVar116));
      auVar231._8_4_ = 0x219392ef;
      auVar231._0_8_ = 0x219392ef219392ef;
      auVar231._12_4_ = 0x219392ef;
      auVar231._16_4_ = 0x219392ef;
      auVar231._20_4_ = 0x219392ef;
      auVar231._24_4_ = 0x219392ef;
      auVar231._28_4_ = 0x219392ef;
      auVar97 = vcmpps_avx(auVar273,auVar231,1);
      auVar177 = ZEXT1632(auVar116);
      auVar166 = vfnmadd213ps_fma(auVar12,auVar177,auVar230);
      auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar12,auVar12);
      auVar216._0_4_ = auVar116._0_4_ ^ local_660;
      auVar216._4_4_ = auVar116._4_4_ ^ uStack_65c;
      auVar216._8_4_ = auVar116._8_4_ ^ uStack_658;
      auVar216._12_4_ = auVar116._12_4_ ^ uStack_654;
      auVar216._16_4_ = fStack_650;
      auVar216._20_4_ = fStack_64c;
      auVar216._24_4_ = fStack_648;
      auVar216._28_4_ = uStack_644;
      auVar37._4_4_ = auVar166._4_4_ * (float)(auVar147._4_4_ ^ uStack_65c);
      auVar37._0_4_ = auVar166._0_4_ * (float)(auVar147._0_4_ ^ local_660);
      auVar37._8_4_ = auVar166._8_4_ * (float)(auVar147._8_4_ ^ uStack_658);
      auVar37._12_4_ = auVar166._12_4_ * (float)(auVar147._12_4_ ^ uStack_654);
      auVar37._16_4_ = fStack_650 * 0.0;
      auVar37._20_4_ = fStack_64c * 0.0;
      auVar37._24_4_ = fStack_648 * 0.0;
      auVar37._28_4_ = uStack_644;
      auVar273 = vcmpps_avx(auVar177,auVar216,1);
      auVar273 = vorps_avx(auVar273,auVar97);
      auVar273 = vblendvps_avx(auVar37,auVar264,auVar273);
      auVar245 = ZEXT3264(auVar273);
      _local_ac0 = vmaxps_avx(auVar153,auVar273);
      auVar273 = vcmpps_avx(auVar177,auVar216,6);
      auVar273 = vorps_avx(auVar97,auVar273);
      auVar102._8_4_ = 0x7f800000;
      auVar102._0_8_ = 0x7f8000007f800000;
      auVar102._12_4_ = 0x7f800000;
      auVar102._16_4_ = 0x7f800000;
      auVar102._20_4_ = 0x7f800000;
      auVar102._24_4_ = 0x7f800000;
      auVar102._28_4_ = 0x7f800000;
      auVar273 = vblendvps_avx(auVar37,auVar102,auVar273);
      auVar94 = vandps_avx(auVar94,local_4e0);
      local_420 = vminps_avx(auVar11,auVar273);
      auVar273 = vcmpps_avx(_local_ac0,local_420,2);
      auVar97 = auVar94 & auVar273;
      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar97 >> 0x7f,0) == '\0') &&
            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0xbf,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f])
      {
        auVar271 = ZEXT3264(local_a80);
      }
      else {
        auVar97 = vminps_avx(local_380,auVar230);
        auVar97 = vmaxps_avx(auVar97,ZEXT832(0) << 0x20);
        auVar58._4_4_ = fStack_39c;
        auVar58._0_4_ = local_3a0;
        auVar58._8_4_ = fStack_398;
        auVar58._12_4_ = fStack_394;
        auVar58._16_4_ = uStack_390;
        auVar58._20_4_ = uStack_38c;
        auVar58._24_4_ = uStack_388;
        auVar58._28_4_ = uStack_384;
        auVar153 = vminps_avx(auVar58,auVar230);
        auVar153 = vmaxps_avx(auVar153,ZEXT832(0) << 0x20);
        auVar38._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
        auVar38._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
        auVar38._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
        auVar38._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
        auVar38._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
        auVar38._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
        auVar38._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
        auVar38._28_4_ = auVar97._28_4_ + 7.0;
        auVar266 = ZEXT3264(local_7e0);
        auVar166 = vfmadd213ps_fma(auVar38,local_7e0,local_7c0);
        auVar39._4_4_ = (auVar153._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar153._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar153._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar153._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar153._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar153._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar153._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar153._28_4_ + 7.0;
        auVar147 = vfmadd213ps_fma(auVar39,local_7e0,local_7c0);
        auVar97 = vminps_avx(local_800,auVar175);
        auVar153 = vminps_avx(auVar14,auVar15);
        auVar97 = vminps_avx(auVar97,auVar153);
        auVar97 = vsubps_avx(auVar97,_local_680);
        auVar94 = vandps_avx(auVar273,auVar94);
        local_1a0 = ZEXT1632(auVar166);
        local_1c0 = ZEXT1632(auVar147);
        auVar40._4_4_ = auVar97._4_4_ * 0.99999976;
        auVar40._0_4_ = auVar97._0_4_ * 0.99999976;
        auVar40._8_4_ = auVar97._8_4_ * 0.99999976;
        auVar40._12_4_ = auVar97._12_4_ * 0.99999976;
        auVar40._16_4_ = auVar97._16_4_ * 0.99999976;
        auVar40._20_4_ = auVar97._20_4_ * 0.99999976;
        auVar40._24_4_ = auVar97._24_4_ * 0.99999976;
        auVar40._28_4_ = 0x3f7ffffc;
        auVar273 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
        auVar41._4_4_ = auVar273._4_4_ * auVar273._4_4_;
        auVar41._0_4_ = auVar273._0_4_ * auVar273._0_4_;
        auVar41._8_4_ = auVar273._8_4_ * auVar273._8_4_;
        auVar41._12_4_ = auVar273._12_4_ * auVar273._12_4_;
        auVar41._16_4_ = auVar273._16_4_ * auVar273._16_4_;
        auVar41._20_4_ = auVar273._20_4_ * auVar273._20_4_;
        auVar41._24_4_ = auVar273._24_4_ * auVar273._24_4_;
        auVar41._28_4_ = auVar273._28_4_;
        auVar97 = vsubps_avx(auVar178,auVar41);
        auVar245 = ZEXT3264(auVar97);
        auVar42._4_4_ = auVar97._4_4_ * fVar141 * 4.0;
        auVar42._0_4_ = auVar97._0_4_ * fVar139 * 4.0;
        auVar42._8_4_ = auVar97._8_4_ * fStack_998;
        auVar42._12_4_ = auVar97._12_4_ * fStack_994;
        auVar42._16_4_ = auVar97._16_4_ * fStack_990;
        auVar42._20_4_ = auVar97._20_4_ * fStack_98c;
        auVar42._24_4_ = auVar97._24_4_ * fStack_988;
        auVar42._28_4_ = auVar273._28_4_;
        auVar273 = vsubps_avx(auVar29,auVar42);
        auVar52 = ZEXT412(0);
        auVar153 = ZEXT1232(auVar52) << 0x20;
        local_8e0 = ZEXT1232(auVar52) << 0x20;
        local_a00 = vcmpps_avx(auVar273,ZEXT832(0) << 0x20,5);
        auVar250 = ZEXT3264(local_a00);
        if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a00 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a00 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a00 >> 0x7f,0) == '\0') &&
              (local_a00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a00 >> 0xbf,0) == '\0') &&
            (local_a00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a00[0x1f]) {
          _local_680 = ZEXT1232(auVar52) << 0x20;
          auVar178 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar197 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar217._8_4_ = 0x7f800000;
          auVar217._0_8_ = 0x7f8000007f800000;
          auVar217._12_4_ = 0x7f800000;
          auVar217._16_4_ = 0x7f800000;
          auVar217._20_4_ = 0x7f800000;
          auVar217._24_4_ = 0x7f800000;
          auVar217._28_4_ = 0x7f800000;
          auVar223._8_4_ = 0xff800000;
          auVar223._0_8_ = 0xff800000ff800000;
          auVar223._12_4_ = 0xff800000;
          auVar223._16_4_ = 0xff800000;
          auVar223._20_4_ = 0xff800000;
          auVar223._24_4_ = 0xff800000;
          auVar223._28_4_ = 0xff800000;
          local_a00 = auVar13;
          local_8c0 = local_8e0;
        }
        else {
          auVar11 = vsqrtps_avx(auVar273);
          auVar179._0_4_ = fVar139 + fVar139;
          auVar179._4_4_ = fVar141 + fVar141;
          auVar179._8_4_ = fVar140 + fVar140;
          auVar179._12_4_ = fVar142 + fVar142;
          auVar179._16_4_ = fVar144 + fVar144;
          auVar179._20_4_ = fVar146 + fVar146;
          auVar179._24_4_ = fVar267 + fVar267;
          auVar179._28_4_ = fVar114 + fVar114;
          auVar153 = vrcpps_avx(auVar179);
          auVar166 = vfnmadd213ps_fma(auVar179,auVar153,auVar230);
          auVar166 = vfmadd132ps_fma(ZEXT1632(auVar166),auVar153,auVar153);
          auVar205._0_4_ = (uint)local_640._0_4_ ^ local_660;
          auVar205._4_4_ = (uint)local_640._4_4_ ^ uStack_65c;
          auVar205._8_4_ = (uint)local_640._8_4_ ^ uStack_658;
          auVar205._12_4_ = (uint)local_640._12_4_ ^ uStack_654;
          auVar205._16_4_ = (uint)local_640._16_4_ ^ (uint)fStack_650;
          auVar205._20_4_ = (uint)local_640._20_4_ ^ (uint)fStack_64c;
          auVar205._24_4_ = (uint)local_640._24_4_ ^ (uint)fStack_648;
          auVar205._28_4_ = (uint)local_640._28_4_ ^ uStack_644;
          auVar153 = vsubps_avx(auVar205,auVar11);
          auVar11 = vsubps_avx(auVar11,local_640);
          fVar267 = auVar153._0_4_ * auVar166._0_4_;
          fVar159 = auVar153._4_4_ * auVar166._4_4_;
          auVar43._4_4_ = fVar159;
          auVar43._0_4_ = fVar267;
          fVar183 = auVar153._8_4_ * auVar166._8_4_;
          auVar43._8_4_ = fVar183;
          fVar184 = auVar153._12_4_ * auVar166._12_4_;
          auVar43._12_4_ = fVar184;
          fVar185 = auVar153._16_4_ * 0.0;
          auVar43._16_4_ = fVar185;
          fVar186 = auVar153._20_4_ * 0.0;
          auVar43._20_4_ = fVar186;
          fVar187 = auVar153._24_4_ * 0.0;
          auVar43._24_4_ = fVar187;
          auVar43._28_4_ = 0x3f800000;
          fVar114 = auVar11._0_4_ * auVar166._0_4_;
          fVar139 = auVar11._4_4_ * auVar166._4_4_;
          auVar44._4_4_ = fVar139;
          auVar44._0_4_ = fVar114;
          fVar141 = auVar11._8_4_ * auVar166._8_4_;
          auVar44._8_4_ = fVar141;
          fVar140 = auVar11._12_4_ * auVar166._12_4_;
          auVar44._12_4_ = fVar140;
          fVar142 = auVar11._16_4_ * 0.0;
          auVar44._16_4_ = fVar142;
          fVar144 = auVar11._20_4_ * 0.0;
          auVar44._20_4_ = fVar144;
          fVar146 = auVar11._24_4_ * 0.0;
          auVar44._24_4_ = fVar146;
          auVar44._28_4_ = auVar94._28_4_;
          auVar166 = vfmadd213ps_fma(local_3c0,auVar43,local_3e0);
          auVar147 = vfmadd213ps_fma(local_3c0,auVar44,local_3e0);
          auVar45._28_4_ = auVar153._28_4_;
          auVar45._0_28_ =
               ZEXT1628(CONCAT412(fVar143 * auVar166._12_4_,
                                  CONCAT48(fVar145 * auVar166._8_4_,
                                           CONCAT44(fVar138 * auVar166._4_4_,
                                                    fVar137 * auVar166._0_4_))));
          auVar153 = ZEXT1632(CONCAT412(fVar143 * auVar147._12_4_,
                                        CONCAT48(fVar145 * auVar147._8_4_,
                                                 CONCAT44(fVar138 * auVar147._4_4_,
                                                          fVar137 * auVar147._0_4_))));
          auVar166 = vfmadd213ps_fma(_local_6a0,auVar45,auVar174);
          auVar147 = vfmadd213ps_fma(_local_6a0,auVar153,auVar174);
          auVar116 = vfmadd213ps_fma(local_600,auVar45,auVar95);
          auVar80 = vfmadd213ps_fma(local_600,auVar153,auVar95);
          auVar117 = vfmadd213ps_fma(auVar45,local_5e0,local_5c0);
          auVar88 = vfmadd213ps_fma(local_5e0,auVar153,local_5c0);
          auVar46._4_4_ = fVar159 * (float)local_860._4_4_;
          auVar46._0_4_ = fVar267 * (float)local_860._0_4_;
          auVar46._8_4_ = fVar183 * fStack_858;
          auVar46._12_4_ = fVar184 * fStack_854;
          auVar46._16_4_ = fVar185 * fStack_850;
          auVar46._20_4_ = fVar186 * fStack_84c;
          auVar46._24_4_ = fVar187 * fStack_848;
          auVar46._28_4_ = 0;
          auVar153 = vsubps_avx(auVar46,ZEXT1632(auVar166));
          auVar180._0_4_ = (float)local_840._0_4_ * fVar267;
          auVar180._4_4_ = (float)local_840._4_4_ * fVar159;
          auVar180._8_4_ = fStack_838 * fVar183;
          auVar180._12_4_ = fStack_834 * fVar184;
          auVar180._16_4_ = fStack_830 * fVar185;
          auVar180._20_4_ = fStack_82c * fVar186;
          auVar180._24_4_ = fStack_828 * fVar187;
          auVar180._28_4_ = 0;
          auVar178 = vsubps_avx(auVar180,ZEXT1632(auVar116));
          auVar218._0_4_ = (float)local_9c0._0_4_ * fVar267;
          auVar218._4_4_ = (float)local_9c0._4_4_ * fVar159;
          auVar218._8_4_ = fStack_9b8 * fVar183;
          auVar218._12_4_ = fStack_9b4 * fVar184;
          auVar218._16_4_ = fStack_9b0 * fVar185;
          auVar218._20_4_ = fStack_9ac * fVar186;
          auVar218._24_4_ = fStack_9a8 * fVar187;
          auVar218._28_4_ = 0;
          auVar11 = vsubps_avx(auVar218,ZEXT1632(auVar117));
          auVar197 = auVar11._0_28_;
          auVar47._4_4_ = fVar139 * (float)local_860._4_4_;
          auVar47._0_4_ = fVar114 * (float)local_860._0_4_;
          auVar47._8_4_ = fVar141 * fStack_858;
          auVar47._12_4_ = fVar140 * fStack_854;
          auVar47._16_4_ = fVar142 * fStack_850;
          auVar47._20_4_ = fVar144 * fStack_84c;
          auVar47._24_4_ = fVar146 * fStack_848;
          auVar47._28_4_ = 0;
          local_8c0 = vsubps_avx(auVar47,ZEXT1632(auVar147));
          auVar48._4_4_ = (float)local_840._4_4_ * fVar139;
          auVar48._0_4_ = (float)local_840._0_4_ * fVar114;
          auVar48._8_4_ = fStack_838 * fVar141;
          auVar48._12_4_ = fStack_834 * fVar140;
          auVar48._16_4_ = fStack_830 * fVar142;
          auVar48._20_4_ = fStack_82c * fVar144;
          auVar48._24_4_ = fStack_828 * fVar146;
          auVar48._28_4_ = local_8c0._28_4_;
          local_8e0 = vsubps_avx(auVar48,ZEXT1632(auVar80));
          auVar49._4_4_ = (float)local_9c0._4_4_ * fVar139;
          auVar49._0_4_ = (float)local_9c0._0_4_ * fVar114;
          auVar49._8_4_ = fStack_9b8 * fVar141;
          auVar49._12_4_ = fStack_9b4 * fVar140;
          auVar49._16_4_ = fStack_9b0 * fVar142;
          auVar49._20_4_ = fStack_9ac * fVar144;
          auVar49._24_4_ = fStack_9a8 * fVar146;
          auVar49._28_4_ = local_8e0._28_4_;
          _local_680 = vsubps_avx(auVar49,ZEXT1632(auVar88));
          auVar11 = vcmpps_avx(auVar273,_DAT_01faff00,5);
          auVar219._8_4_ = 0x7f800000;
          auVar219._0_8_ = 0x7f8000007f800000;
          auVar219._12_4_ = 0x7f800000;
          auVar219._16_4_ = 0x7f800000;
          auVar219._20_4_ = 0x7f800000;
          auVar219._24_4_ = 0x7f800000;
          auVar219._28_4_ = 0x7f800000;
          auVar217 = vblendvps_avx(auVar219,auVar43,auVar11);
          auVar55._4_4_ = uStack_89c;
          auVar55._0_4_ = local_8a0;
          auVar55._8_4_ = uStack_898;
          auVar55._12_4_ = uStack_894;
          auVar55._16_4_ = uStack_890;
          auVar55._20_4_ = uStack_88c;
          auVar55._24_4_ = uStack_888;
          auVar55._28_4_ = uStack_884;
          auVar273 = vandps_avx(auVar55,local_620);
          auVar273 = vmaxps_avx(local_520,auVar273);
          auVar50._4_4_ = auVar273._4_4_ * 1.9073486e-06;
          auVar50._0_4_ = auVar273._0_4_ * 1.9073486e-06;
          auVar50._8_4_ = auVar273._8_4_ * 1.9073486e-06;
          auVar50._12_4_ = auVar273._12_4_ * 1.9073486e-06;
          auVar50._16_4_ = auVar273._16_4_ * 1.9073486e-06;
          auVar50._20_4_ = auVar273._20_4_ * 1.9073486e-06;
          auVar50._24_4_ = auVar273._24_4_ * 1.9073486e-06;
          auVar50._28_4_ = auVar273._28_4_;
          auVar273 = vandps_avx(auVar55,local_540);
          auVar273 = vcmpps_avx(auVar273,auVar50,1);
          auVar241 = ZEXT3264(auVar273);
          auVar224._8_4_ = 0xff800000;
          auVar224._0_8_ = 0xff800000ff800000;
          auVar224._12_4_ = 0xff800000;
          auVar224._16_4_ = 0xff800000;
          auVar224._20_4_ = 0xff800000;
          auVar224._24_4_ = 0xff800000;
          auVar224._28_4_ = 0xff800000;
          auVar223 = vblendvps_avx(auVar224,auVar44,auVar11);
          auVar12 = auVar11 & auVar273;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar12 >> 0x7f,0) == '\0') &&
                (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar12 >> 0xbf,0) == '\0') &&
              (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar12[0x1f]) {
            auVar250 = ZEXT3264(local_a00);
          }
          else {
            auVar273 = vandps_avx(auVar273,auVar11);
            auVar12 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,2);
            auVar245 = ZEXT3264(auVar12);
            auVar261._8_4_ = 0xff800000;
            auVar261._0_8_ = 0xff800000ff800000;
            auVar261._12_4_ = 0xff800000;
            auVar261._16_4_ = 0xff800000;
            auVar261._20_4_ = 0xff800000;
            auVar261._24_4_ = 0xff800000;
            auVar261._28_4_ = 0xff800000;
            auVar265._8_4_ = 0x7f800000;
            auVar265._0_8_ = 0x7f8000007f800000;
            auVar265._12_4_ = 0x7f800000;
            auVar265._16_4_ = 0x7f800000;
            auVar265._20_4_ = 0x7f800000;
            auVar265._24_4_ = 0x7f800000;
            auVar265._28_4_ = 0x7f800000;
            auVar266 = ZEXT3264(auVar265);
            auVar97 = vblendvps_avx(auVar265,auVar261,auVar12);
            auVar166 = vpackssdw_avx(auVar273._0_16_,auVar273._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar166);
            auVar241 = ZEXT3264(auVar13);
            auVar217 = vblendvps_avx(auVar217,auVar97,auVar13);
            auVar97 = vblendvps_avx(auVar261,auVar265,auVar12);
            auVar223 = vblendvps_avx(auVar223,auVar97,auVar13);
            auVar237._0_8_ = auVar273._0_8_ ^ 0xffffffffffffffff;
            auVar237._8_4_ = auVar273._8_4_ ^ 0xffffffff;
            auVar237._12_4_ = auVar273._12_4_ ^ 0xffffffff;
            auVar237._16_4_ = auVar273._16_4_ ^ 0xffffffff;
            auVar237._20_4_ = auVar273._20_4_ ^ 0xffffffff;
            auVar237._24_4_ = auVar273._24_4_ ^ 0xffffffff;
            auVar237._28_4_ = auVar273._28_4_ ^ 0xffffffff;
            auVar273 = vorps_avx(auVar12,auVar237);
            auVar273 = vandps_avx(auVar273,auVar11);
            auVar250 = ZEXT3264(auVar273);
          }
        }
        auVar238 = ZEXT3264(auVar94);
        auVar272 = local_9c0._0_28_;
        local_480 = _local_ac0;
        local_460 = vminps_avx(local_420,auVar217);
        local_440 = vmaxps_avx(_local_ac0,auVar223);
        auVar273 = vcmpps_avx(_local_ac0,local_460,2);
        local_5c0 = vandps_avx(auVar94,auVar273);
        auVar273 = vcmpps_avx(local_440,local_420,2);
        local_600 = vandps_avx(auVar94,auVar273);
        auVar94 = vorps_avx(local_600,local_5c0);
        auVar271 = ZEXT3264(local_a80);
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar94 >> 0x7f,0) != '\0') ||
              (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0xbf,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar94[0x1f] < '\0') {
          _local_6a0 = local_440;
          auVar273 = _local_6a0;
          local_620._0_8_ = auVar250._0_8_ ^ 0xffffffffffffffff;
          local_620._8_4_ = auVar250._8_4_ ^ 0xffffffff;
          local_620._12_4_ = auVar250._12_4_ ^ 0xffffffff;
          local_620._16_4_ = auVar250._16_4_ ^ 0xffffffff;
          local_620._20_4_ = auVar250._20_4_ ^ 0xffffffff;
          local_620._24_4_ = auVar250._24_4_ ^ 0xffffffff;
          local_620._28_4_ = auVar250._28_4_ ^ 0xffffffff;
          auVar51._4_4_ = (float)local_9c0._4_4_ * auVar197._4_4_;
          auVar51._0_4_ = (float)local_9c0._0_4_ * auVar197._0_4_;
          auVar51._8_4_ = fStack_9b8 * auVar197._8_4_;
          auVar51._12_4_ = fStack_9b4 * auVar197._12_4_;
          auVar51._16_4_ = fStack_9b0 * auVar197._16_4_;
          auVar51._20_4_ = fStack_9ac * auVar197._20_4_;
          auVar51._24_4_ = fStack_9a8 * auVar197._24_4_;
          auVar51._28_4_ = auVar94._28_4_;
          auVar166 = vfmadd213ps_fma(auVar178,_local_840,auVar51);
          auVar166 = vfmadd213ps_fma(auVar153,_local_860,ZEXT1632(auVar166));
          auVar56._4_4_ = uStack_89c;
          auVar56._0_4_ = local_8a0;
          auVar56._8_4_ = uStack_898;
          auVar56._12_4_ = uStack_894;
          auVar56._16_4_ = uStack_890;
          auVar56._20_4_ = uStack_88c;
          auVar56._24_4_ = uStack_888;
          auVar56._28_4_ = uStack_884;
          auVar94 = vandps_avx(ZEXT1632(auVar166),auVar56);
          auVar130._8_4_ = 0x3e99999a;
          auVar130._0_8_ = 0x3e99999a3e99999a;
          auVar130._12_4_ = 0x3e99999a;
          auVar130._16_4_ = 0x3e99999a;
          auVar130._20_4_ = 0x3e99999a;
          auVar130._24_4_ = 0x3e99999a;
          auVar130._28_4_ = 0x3e99999a;
          auVar94 = vcmpps_avx(auVar94,auVar130,1);
          auVar94 = vorps_avx(auVar94,local_620);
          auVar131._8_4_ = 3;
          auVar131._0_8_ = 0x300000003;
          auVar131._12_4_ = 3;
          auVar131._16_4_ = 3;
          auVar131._20_4_ = 3;
          auVar131._24_4_ = 3;
          auVar131._28_4_ = 3;
          auVar154._8_4_ = 2;
          auVar154._0_8_ = 0x200000002;
          auVar154._12_4_ = 2;
          auVar154._16_4_ = 2;
          auVar154._20_4_ = 2;
          auVar154._24_4_ = 2;
          auVar154._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar154,auVar131,auVar94);
          local_640._4_4_ = (float)local_c48;
          local_640._0_4_ = (float)local_c48;
          local_640._8_4_ = (float)local_c48;
          local_640._12_4_ = (float)local_c48;
          local_640._16_4_ = (float)local_c48;
          local_640._20_4_ = (float)local_c48;
          local_640._24_4_ = (float)local_c48;
          local_640._28_4_ = (float)local_c48;
          local_5e0 = vpcmpgtd_avx2(auVar94,local_640);
          local_5a0 = vpandn_avx2(local_5e0,local_5c0);
          auVar241 = ZEXT3264(local_5a0);
          auVar94 = local_5c0 & ~local_5e0;
          fStack_b2c = auVar8._4_4_;
          fStack_b28 = auVar8._8_4_;
          fStack_b24 = auVar8._12_4_;
          if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0x7f,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0xbf,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar94[0x1f]) {
            auVar103._4_4_ = fVar233;
            auVar103._0_4_ = fVar233;
            auVar103._8_4_ = fVar233;
            auVar103._12_4_ = fVar233;
            auVar103._16_4_ = fVar233;
            auVar103._20_4_ = fVar233;
            auVar103._24_4_ = fVar233;
            auVar103._28_4_ = fVar233;
            local_6a0._0_4_ = local_440._0_4_;
            local_6a0._4_4_ = local_440._4_4_;
            fStack_698 = local_440._8_4_;
            fStack_694 = local_440._12_4_;
            fStack_690 = local_440._16_4_;
            fStack_68c = local_440._20_4_;
            fStack_688 = local_440._24_4_;
            fStack_684 = local_440._28_4_;
            fVar114 = (float)local_6a0._0_4_;
            fVar137 = (float)local_6a0._4_4_;
            fVar138 = fStack_698;
            fVar139 = fStack_694;
            fVar145 = fStack_690;
            fVar141 = fStack_68c;
            fVar143 = fStack_688;
            fVar140 = fStack_684;
            _local_6a0 = auVar273;
          }
          else {
            auVar147 = vminps_avx(auVar9,auVar81);
            auVar166 = vmaxps_avx(auVar9,auVar81);
            auVar116 = vminps_avx(auVar82,auVar8);
            auVar80 = vminps_avx(auVar147,auVar116);
            auVar147 = vmaxps_avx(auVar82,auVar8);
            auVar116 = vmaxps_avx(auVar166,auVar147);
            auVar166 = vandps_avx(auVar80,auVar225);
            auVar147 = vandps_avx(auVar116,auVar225);
            auVar166 = vmaxps_avx(auVar166,auVar147);
            auVar147 = vmovshdup_avx(auVar166);
            auVar147 = vmaxss_avx(auVar147,auVar166);
            auVar166 = vshufpd_avx(auVar166,auVar166,1);
            auVar166 = vmaxss_avx(auVar166,auVar147);
            local_a00._0_4_ = auVar166._0_4_ * 1.9073486e-06;
            local_820 = vshufps_avx(auVar116,auVar116,0xff);
            local_880._4_4_ = (float)local_ac0._4_4_ + (float)local_980._4_4_;
            local_880._0_4_ = (float)local_ac0._0_4_ + (float)local_980._0_4_;
            fStack_878 = fStack_ab8 + fStack_978;
            fStack_874 = fStack_ab4 + fStack_974;
            fStack_870 = fStack_ab0 + fStack_970;
            fStack_86c = fStack_aac + fStack_96c;
            fStack_868 = fStack_aa8 + fStack_968;
            fStack_864 = fStack_aa4 + fStack_964;
            do {
              auVar104._8_4_ = 0x7f800000;
              auVar104._0_8_ = 0x7f8000007f800000;
              auVar104._12_4_ = 0x7f800000;
              auVar104._16_4_ = 0x7f800000;
              auVar104._20_4_ = 0x7f800000;
              auVar104._24_4_ = 0x7f800000;
              auVar104._28_4_ = 0x7f800000;
              auVar94 = auVar241._0_32_;
              auVar273 = vblendvps_avx(auVar104,_local_ac0,auVar94);
              auVar97 = vshufps_avx(auVar273,auVar273,0xb1);
              auVar97 = vminps_avx(auVar273,auVar97);
              auVar153 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar153);
              auVar153 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar153);
              auVar273 = vcmpps_avx(auVar273,auVar97,0);
              auVar97 = auVar94 & auVar273;
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar97 >> 0x7f,0) != '\0') ||
                    (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar97 >> 0xbf,0) != '\0') ||
                  (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar97[0x1f] < '\0') {
                auVar94 = vandps_avx(auVar273,auVar94);
              }
              uVar69 = vmovmskps_avx(auVar94);
              iVar16 = 0;
              for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar70 = iVar16 << 2;
              *(undefined4 *)(local_5a0 + uVar70) = 0;
              uVar69 = *(uint *)(local_1a0 + uVar70);
              uVar70 = *(uint *)(local_480 + uVar70);
              fVar114 = auVar5._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                auVar266 = ZEXT1664(auVar266._0_16_);
                fVar114 = sqrtf((float)local_9e0._0_4_);
              }
              local_7a0._0_4_ = fVar114 * 1.9073486e-06;
              auVar166 = vinsertps_avx(ZEXT416(uVar70),ZEXT416(uVar69),0x10);
              lVar71 = 5;
              do {
                auVar116 = vmovshdup_avx(auVar166);
                fVar145 = 1.0 - auVar116._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar145);
                auVar147 = vshufps_avx(auVar166,auVar166,0x55);
                fVar114 = auVar147._0_4_;
                auVar118._0_4_ = fVar111 * fVar114;
                fVar137 = auVar147._4_4_;
                auVar118._4_4_ = auVar81._4_4_ * fVar137;
                fVar138 = auVar147._8_4_;
                auVar118._8_4_ = auVar81._8_4_ * fVar138;
                fVar139 = auVar147._12_4_;
                auVar118._12_4_ = auVar81._12_4_ * fVar139;
                auVar148._4_4_ = fVar145;
                auVar148._0_4_ = fVar145;
                auVar148._8_4_ = fVar145;
                auVar148._12_4_ = fVar145;
                auVar147 = vfmadd231ps_fma(auVar118,auVar148,auVar9);
                auVar160._0_4_ = fVar112 * fVar114;
                auVar160._4_4_ = auVar82._4_4_ * fVar137;
                auVar160._8_4_ = auVar82._8_4_ * fVar138;
                auVar160._12_4_ = auVar82._12_4_ * fVar139;
                auVar80 = vfmadd231ps_fma(auVar160,auVar148,auVar81);
                auVar210._0_4_ = fVar114 * auVar80._0_4_;
                auVar210._4_4_ = fVar137 * auVar80._4_4_;
                auVar210._8_4_ = fVar138 * auVar80._8_4_;
                auVar210._12_4_ = fVar139 * auVar80._12_4_;
                auVar117 = vfmadd231ps_fma(auVar210,auVar148,auVar147);
                auVar119._0_4_ = fVar114 * fVar113;
                auVar119._4_4_ = fVar137 * fStack_b2c;
                auVar119._8_4_ = fVar138 * fStack_b28;
                auVar119._12_4_ = fVar139 * fStack_b24;
                auVar147 = vfmadd231ps_fma(auVar119,auVar148,auVar82);
                auVar191._0_4_ = fVar114 * auVar147._0_4_;
                auVar191._4_4_ = fVar137 * auVar147._4_4_;
                auVar191._8_4_ = fVar138 * auVar147._8_4_;
                auVar191._12_4_ = fVar139 * auVar147._12_4_;
                auVar80 = vfmadd231ps_fma(auVar191,auVar148,auVar80);
                fVar141 = auVar166._0_4_;
                auVar120._4_4_ = fVar141;
                auVar120._0_4_ = fVar141;
                auVar120._8_4_ = fVar141;
                auVar120._12_4_ = fVar141;
                auVar147 = vfmadd213ps_fma(auVar120,local_9d0,_DAT_01f7aa10);
                auVar83._0_4_ = fVar114 * auVar80._0_4_;
                auVar83._4_4_ = fVar137 * auVar80._4_4_;
                auVar83._8_4_ = fVar138 * auVar80._8_4_;
                auVar83._12_4_ = fVar139 * auVar80._12_4_;
                auVar88 = vfmadd231ps_fma(auVar83,auVar117,auVar148);
                local_780._0_16_ = auVar88;
                auVar147 = vsubps_avx(auVar147,auVar88);
                _local_960 = auVar147;
                auVar147 = vdpps_avx(auVar147,auVar147,0x7f);
                fVar114 = auVar147._0_4_;
                if (fVar114 < 0.0) {
                  local_aa0._0_16_ = ZEXT416((uint)fVar145);
                  auVar266 = ZEXT1664(auVar266._0_16_);
                  auVar271._0_4_ = sqrtf(fVar114);
                  auVar271._4_60_ = extraout_var;
                  auVar88 = auVar271._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar147,auVar147);
                }
                auVar80 = vsubps_avx(auVar80,auVar117);
                auVar221._0_4_ = auVar80._0_4_ * 3.0;
                auVar221._4_4_ = auVar80._4_4_ * 3.0;
                auVar221._8_4_ = auVar80._8_4_ * 3.0;
                auVar221._12_4_ = auVar80._12_4_ * 3.0;
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_aa0._0_16_,auVar116);
                auVar117 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar116,local_aa0._0_16_)
                ;
                fVar137 = local_aa0._0_4_ * 6.0;
                fVar138 = auVar80._0_4_ * 6.0;
                fVar139 = auVar117._0_4_ * 6.0;
                fVar145 = auVar116._0_4_ * 6.0;
                auVar161._0_4_ = fVar145 * fVar113;
                auVar161._4_4_ = fVar145 * fStack_b2c;
                auVar161._8_4_ = fVar145 * fStack_b28;
                auVar161._12_4_ = fVar145 * fStack_b24;
                auVar121._4_4_ = fVar139;
                auVar121._0_4_ = fVar139;
                auVar121._8_4_ = fVar139;
                auVar121._12_4_ = fVar139;
                auVar116 = vfmadd132ps_fma(auVar121,auVar161,auVar82);
                auVar162._4_4_ = fVar138;
                auVar162._0_4_ = fVar138;
                auVar162._8_4_ = fVar138;
                auVar162._12_4_ = fVar138;
                auVar116 = vfmadd132ps_fma(auVar162,auVar116,auVar81);
                auVar80 = vdpps_avx(auVar221,auVar221,0x7f);
                auVar122._4_4_ = fVar137;
                auVar122._0_4_ = fVar137;
                auVar122._8_4_ = fVar137;
                auVar122._12_4_ = fVar137;
                auVar190 = vfmadd132ps_fma(auVar122,auVar116,auVar9);
                auVar116 = vblendps_avx(auVar80,_DAT_01f7aa10,0xe);
                auVar117 = vrsqrtss_avx(auVar116,auVar116);
                fVar139 = auVar80._0_4_;
                fVar137 = auVar117._0_4_;
                auVar117 = vdpps_avx(auVar221,auVar190,0x7f);
                fVar137 = fVar137 * 1.5 + fVar139 * -0.5 * fVar137 * fVar137 * fVar137;
                auVar123._0_4_ = auVar190._0_4_ * fVar139;
                auVar123._4_4_ = auVar190._4_4_ * fVar139;
                auVar123._8_4_ = auVar190._8_4_ * fVar139;
                auVar123._12_4_ = auVar190._12_4_ * fVar139;
                fVar138 = auVar117._0_4_;
                auVar211._0_4_ = auVar221._0_4_ * fVar138;
                auVar211._4_4_ = auVar221._4_4_ * fVar138;
                auVar211._8_4_ = auVar221._8_4_ * fVar138;
                auVar211._12_4_ = auVar221._12_4_ * fVar138;
                auVar117 = vsubps_avx(auVar123,auVar211);
                auVar116 = vrcpss_avx(auVar116,auVar116);
                auVar190 = vfnmadd213ss_fma(auVar116,auVar80,ZEXT416(0x40000000));
                fVar138 = auVar116._0_4_ * auVar190._0_4_;
                auVar116 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(fVar141 * (float)local_7a0._0_4_)));
                uVar72 = CONCAT44(auVar221._4_4_,auVar221._0_4_);
                auVar240._0_8_ = uVar72 ^ 0x8000000080000000;
                auVar240._8_4_ = -auVar221._8_4_;
                auVar240._12_4_ = -auVar221._12_4_;
                local_a40._0_4_ = fVar137 * auVar117._0_4_ * fVar138;
                local_a40._4_4_ = fVar137 * auVar117._4_4_ * fVar138;
                local_a40._8_4_ = fVar137 * auVar117._8_4_ * fVar138;
                local_a40._12_4_ = fVar137 * auVar117._12_4_ * fVar138;
                local_a20._0_4_ = auVar221._0_4_ * fVar137;
                local_a20._4_4_ = auVar221._4_4_ * fVar137;
                local_a20._8_4_ = auVar221._8_4_ * fVar137;
                local_a20._12_4_ = auVar221._12_4_ * fVar137;
                local_aa0._0_16_ = auVar221;
                if (fVar139 < -fVar139) {
                  auVar266 = ZEXT1664(auVar266._0_16_);
                  fVar137 = sqrtf(fVar139);
                  auVar88 = ZEXT416(auVar88._0_4_);
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar137 = auVar80._0_4_;
                }
                auVar80 = vdpps_avx(_local_960,local_a20._0_16_,0x7f);
                auVar115 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar88,
                                           ZEXT416((uint)auVar116._0_4_));
                auVar117 = vdpps_avx(auVar240,local_a20._0_16_,0x7f);
                auVar190 = vdpps_avx(_local_960,local_a40._0_16_,0x7f);
                auVar79 = vdpps_avx(local_9d0,local_a20._0_16_,0x7f);
                auVar206 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a00._0_4_ / fVar137)),
                                           auVar115);
                fVar138 = auVar80._0_4_;
                auVar84._0_4_ = fVar138 * fVar138;
                auVar84._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar84._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar84._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar88 = vdpps_avx(_local_960,auVar240,0x7f);
                auVar189 = vsubps_avx(auVar147,auVar84);
                auVar115 = vrsqrtss_avx(auVar189,auVar189);
                fVar139 = auVar189._0_4_;
                fVar137 = auVar115._0_4_;
                fVar137 = fVar137 * 1.5 + fVar139 * -0.5 * fVar137 * fVar137 * fVar137;
                auVar115 = vdpps_avx(_local_960,local_9d0,0x7f);
                local_a20._0_16_ = ZEXT416((uint)(auVar117._0_4_ + auVar190._0_4_));
                local_a40._0_16_ = vfnmadd231ss_fma(auVar88,auVar80,local_a20._0_16_);
                auVar117 = vfnmadd231ss_fma(auVar115,auVar80,auVar79);
                if (fVar139 < 0.0) {
                  local_7c0._0_16_ = auVar79;
                  local_7e0._0_4_ = fVar137;
                  local_800._0_16_ = auVar117;
                  auVar266 = ZEXT1664(auVar266._0_16_);
                  fVar139 = sqrtf(fVar139);
                  fVar137 = (float)local_7e0._0_4_;
                  auVar117 = local_800._0_16_;
                  auVar79 = local_7c0._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar189,auVar189);
                  fVar139 = auVar88._0_4_;
                }
                auVar250 = ZEXT1664(auVar147);
                auVar272 = local_9c0._0_28_;
                auVar271 = ZEXT3264(local_a80);
                auVar245 = ZEXT1664(local_aa0._0_16_);
                auVar88 = vpermilps_avx(local_780._0_16_,0xff);
                fVar139 = fVar139 - auVar88._0_4_;
                auVar190 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xff);
                auVar88 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar137),auVar190);
                auVar163._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
                auVar163._8_4_ = auVar79._8_4_ ^ 0x80000000;
                auVar163._12_4_ = auVar79._12_4_ ^ 0x80000000;
                auVar192._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                auVar192._8_4_ = auVar88._8_4_ ^ 0x80000000;
                auVar192._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar238 = ZEXT1664(local_a20._0_16_);
                auVar117 = ZEXT416((uint)(auVar117._0_4_ * fVar137));
                auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar79._0_4_ * auVar88._0_4_)),
                                          local_a20._0_16_,auVar117);
                auVar117 = vinsertps_avx(auVar192,auVar117,0x1c);
                uVar77 = auVar88._0_4_;
                auVar193._4_4_ = uVar77;
                auVar193._0_4_ = uVar77;
                auVar193._8_4_ = uVar77;
                auVar193._12_4_ = uVar77;
                auVar117 = vdivps_avx(auVar117,auVar193);
                auVar88 = vinsertps_avx(local_a20._0_16_,auVar163,0x10);
                auVar88 = vdivps_avx(auVar88,auVar193);
                auVar149._0_4_ = fVar138 * auVar117._0_4_ + fVar139 * auVar88._0_4_;
                auVar149._4_4_ = fVar138 * auVar117._4_4_ + fVar139 * auVar88._4_4_;
                auVar149._8_4_ = fVar138 * auVar117._8_4_ + fVar139 * auVar88._8_4_;
                auVar149._12_4_ = fVar138 * auVar117._12_4_ + fVar139 * auVar88._12_4_;
                auVar166 = vsubps_avx(auVar166,auVar149);
                auVar80 = vandps_avx(auVar80,auVar225);
                if (auVar80._0_4_ < auVar206._0_4_) {
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar206._0_4_ + auVar116._0_4_)),
                                            local_820,ZEXT416(0x36000000));
                  auVar116 = vandps_avx(ZEXT416((uint)fVar139),auVar225);
                  if (auVar116._0_4_ < auVar80._0_4_) {
                    fVar137 = auVar166._0_4_ + (float)local_910._0_4_;
                    auVar116 = ZEXT416((uint)fVar137);
                    if ((fVar76 <= fVar137) &&
                       (fVar138 = *(float *)(ray + k * 4 + 0x80), fVar137 <= fVar138)) {
                      auVar80 = vmovshdup_avx(auVar166);
                      fVar139 = auVar80._0_4_;
                      if ((0.0 <= fVar139) && (fVar139 <= 1.0)) {
                        auVar80 = vrsqrtss_avx(auVar147,auVar147);
                        fVar145 = auVar80._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar67].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          fVar114 = fVar145 * 1.5 + fVar114 * -0.5 * fVar145 * fVar145 * fVar145;
                          auVar164._0_4_ = fVar114 * (float)local_960._0_4_;
                          auVar164._4_4_ = fVar114 * (float)local_960._4_4_;
                          auVar164._8_4_ = fVar114 * fStack_958;
                          auVar164._12_4_ = fVar114 * fStack_954;
                          auVar190 = vfmadd213ps_fma(auVar190,auVar164,local_aa0._0_16_);
                          auVar80 = vshufps_avx(auVar164,auVar164,0xc9);
                          auVar117 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xc9);
                          auVar165._0_4_ = auVar164._0_4_ * auVar117._0_4_;
                          auVar165._4_4_ = auVar164._4_4_ * auVar117._4_4_;
                          auVar165._8_4_ = auVar164._8_4_ * auVar117._8_4_;
                          auVar165._12_4_ = auVar164._12_4_ * auVar117._12_4_;
                          auVar88 = vfmsub231ps_fma(auVar165,local_aa0._0_16_,auVar80);
                          auVar80 = vshufps_avx(auVar88,auVar88,0xc9);
                          auVar117 = vshufps_avx(auVar190,auVar190,0xc9);
                          auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                          auVar85._0_4_ = auVar190._0_4_ * auVar88._0_4_;
                          auVar85._4_4_ = auVar190._4_4_ * auVar88._4_4_;
                          auVar85._8_4_ = auVar190._8_4_ * auVar88._8_4_;
                          auVar85._12_4_ = auVar190._12_4_ * auVar88._12_4_;
                          auVar80 = vfmsub231ps_fma(auVar85,auVar80,auVar117);
                          uVar77 = auVar80._0_4_;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar137;
                            uVar2 = vextractps_avx(auVar80,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar80,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar77;
                            *(float *)(ray + k * 4 + 0xf0) = fVar139;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_9a0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar67;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_710 = vshufps_avx(auVar166,auVar166,0x55);
                            auVar166 = vshufps_avx(auVar80,auVar80,0x55);
                            auStack_730 = vshufps_avx(auVar80,auVar80,0xaa);
                            local_740 = (RTCHitN  [16])auVar166;
                            local_720 = uVar77;
                            uStack_71c = uVar77;
                            uStack_718 = uVar77;
                            uStack_714 = uVar77;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar137;
                            local_940._0_16_ = *local_a48;
                            local_af0.valid = (int *)local_940;
                            local_af0.geometryUserPtr = pGVar3->userPtr;
                            local_af0.context = context->user;
                            local_af0.hit = local_740;
                            local_af0.N = 4;
                            auVar80 = *local_a48;
                            local_af0.ray = (RTCRayN *)ray;
                            if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar238 = ZEXT1664(local_a20._0_16_);
                              auVar245 = ZEXT1664(local_aa0._0_16_);
                              auVar250 = ZEXT1664(auVar147);
                              auVar266 = ZEXT1664(auVar266._0_16_);
                              (*pGVar3->intersectionFilterN)(&local_af0);
                              auVar134._8_56_ = extraout_var_01;
                              auVar134._0_8_ = extraout_XMM1_Qa;
                              auVar116 = auVar134._0_16_;
                              auVar271 = ZEXT3264(local_a80);
                              auVar80 = local_940._0_16_;
                            }
                            auVar272 = local_9c0._0_28_;
                            if (auVar80 == (undefined1  [16])0x0) {
                              auVar166 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar147 = vpcmpeqd_avx(auVar116,auVar116);
                              auVar166 = auVar166 ^ auVar147;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              auVar147 = vpcmpeqd_avx(auVar166,auVar166);
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar238 = ZEXT1664(auVar238._0_16_);
                                auVar245 = ZEXT1664(auVar245._0_16_);
                                auVar250 = ZEXT1664(auVar250._0_16_);
                                auVar266 = ZEXT1664(auVar266._0_16_);
                                (*p_Var4)(&local_af0);
                                auVar271 = ZEXT3264(local_a80);
                                auVar272 = local_9c0._0_28_;
                                auVar147 = vpcmpeqd_avx(auVar147,auVar147);
                                auVar80 = local_940._0_16_;
                              }
                              auVar116 = vpcmpeqd_avx(auVar80,_DAT_01f7aa10);
                              auVar166 = auVar116 ^ auVar147;
                              if (auVar80 != (undefined1  [16])0x0) {
                                auVar116 = auVar116 ^ auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    local_af0.hit);
                                *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x10));
                                *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x20));
                                *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x30));
                                *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x40));
                                *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x50));
                                *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x60));
                                *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x70));
                                *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x80));
                                *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar147;
                              }
                            }
                            auVar86._8_8_ = 0x100000001;
                            auVar86._0_8_ = 0x100000001;
                            if ((auVar86 & auVar166) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar138;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar71 = lVar71 + -1;
              } while (lVar71 != 0);
              auVar273 = local_5a0;
              uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar103._4_4_ = uVar77;
              auVar103._0_4_ = uVar77;
              auVar103._8_4_ = uVar77;
              auVar103._12_4_ = uVar77;
              auVar103._16_4_ = uVar77;
              auVar103._20_4_ = uVar77;
              auVar103._24_4_ = uVar77;
              auVar103._28_4_ = uVar77;
              auVar94 = vcmpps_avx(_local_880,auVar103,2);
              local_5a0 = vandps_avx(auVar94,local_5a0);
              auVar241 = ZEXT3264(local_5a0);
              auVar273 = auVar273 & auVar94;
            } while ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar273 >> 0x7f,0) != '\0') ||
                       (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar273 >> 0xbf,0) != '\0') ||
                     (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar273[0x1f] < '\0');
            auVar241 = ZEXT3264(local_440);
            fVar114 = (float)local_6a0._0_4_;
            fVar137 = (float)local_6a0._4_4_;
            fVar138 = fStack_698;
            fVar139 = fStack_694;
            fVar145 = fStack_690;
            fVar141 = fStack_68c;
            fVar143 = fStack_688;
            fVar140 = fStack_684;
          }
          auVar135._0_4_ = auVar272._0_4_ * (float)local_680._0_4_;
          auVar135._4_4_ = auVar272._4_4_ * (float)local_680._4_4_;
          auVar135._8_4_ = auVar272._8_4_ * fStack_678;
          auVar135._12_4_ = auVar272._12_4_ * fStack_674;
          auVar135._16_4_ = auVar272._16_4_ * fStack_670;
          auVar135._20_4_ = auVar272._20_4_ * fStack_66c;
          auVar135._28_36_ = auVar241._28_36_;
          auVar135._24_4_ = auVar272._24_4_ * fStack_668;
          auVar166 = vfmadd213ps_fma(local_8e0,_local_840,auVar135._0_32_);
          auVar166 = vfmadd213ps_fma(local_8c0,_local_860,ZEXT1632(auVar166));
          auVar57._4_4_ = uStack_89c;
          auVar57._0_4_ = local_8a0;
          auVar57._8_4_ = uStack_898;
          auVar57._12_4_ = uStack_894;
          auVar57._16_4_ = uStack_890;
          auVar57._20_4_ = uStack_88c;
          auVar57._24_4_ = uStack_888;
          auVar57._28_4_ = uStack_884;
          auVar94 = vandps_avx(ZEXT1632(auVar166),auVar57);
          auVar155._8_4_ = 0x3e99999a;
          auVar155._0_8_ = 0x3e99999a3e99999a;
          auVar155._12_4_ = 0x3e99999a;
          auVar155._16_4_ = 0x3e99999a;
          auVar155._20_4_ = 0x3e99999a;
          auVar155._24_4_ = 0x3e99999a;
          auVar155._28_4_ = 0x3e99999a;
          auVar94 = vcmpps_avx(auVar94,auVar155,1);
          auVar273 = vorps_avx(auVar94,local_620);
          auVar156._0_4_ = fVar114 + (float)local_980._0_4_;
          auVar156._4_4_ = fVar137 + (float)local_980._4_4_;
          auVar156._8_4_ = fVar138 + fStack_978;
          auVar156._12_4_ = fVar139 + fStack_974;
          auVar156._16_4_ = fVar145 + fStack_970;
          auVar156._20_4_ = fVar141 + fStack_96c;
          auVar156._24_4_ = fVar143 + fStack_968;
          auVar156._28_4_ = fVar140 + fStack_964;
          auVar94 = vcmpps_avx(auVar156,auVar103,2);
          local_8c0 = vandps_avx(auVar94,local_600);
          auVar157._8_4_ = 3;
          auVar157._0_8_ = 0x300000003;
          auVar157._12_4_ = 3;
          auVar157._16_4_ = 3;
          auVar157._20_4_ = 3;
          auVar157._24_4_ = 3;
          auVar157._28_4_ = 3;
          auVar181._8_4_ = 2;
          auVar181._0_8_ = 0x200000002;
          auVar181._12_4_ = 2;
          auVar181._16_4_ = 2;
          auVar181._20_4_ = 2;
          auVar181._24_4_ = 2;
          auVar181._28_4_ = 2;
          auVar94 = vblendvps_avx(auVar181,auVar157,auVar273);
          local_8e0 = vpcmpgtd_avx2(auVar94,local_640);
          auVar94 = vpandn_avx2(local_8e0,local_8c0);
          auVar273 = local_8c0 & ~local_8e0;
          local_940 = auVar94;
          if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar273 >> 0x7f,0) != '\0') ||
                (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar273 >> 0xbf,0) != '\0') ||
              (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar273[0x1f] < '\0') {
            auVar147 = vminps_avx(auVar9,auVar81);
            auVar166 = vmaxps_avx(auVar9,auVar81);
            auVar116 = vminps_avx(auVar82,auVar8);
            auVar80 = vminps_avx(auVar147,auVar116);
            auVar147 = vmaxps_avx(auVar82,auVar8);
            auVar116 = vmaxps_avx(auVar166,auVar147);
            auVar166 = vandps_avx(auVar80,auVar225);
            auVar147 = vandps_avx(auVar116,auVar225);
            auVar166 = vmaxps_avx(auVar166,auVar147);
            auVar147 = vmovshdup_avx(auVar166);
            auVar147 = vmaxss_avx(auVar147,auVar166);
            auVar166 = vshufpd_avx(auVar166,auVar166,1);
            auVar166 = vmaxss_avx(auVar166,auVar147);
            local_a00._0_4_ = auVar166._0_4_ * 1.9073486e-06;
            local_820 = vshufps_avx(auVar116,auVar116,0xff);
            local_880._4_4_ = (float)local_980._4_4_ + local_440._4_4_;
            local_880._0_4_ = (float)local_980._0_4_ + local_440._0_4_;
            fStack_878 = fStack_978 + local_440._8_4_;
            fStack_874 = fStack_974 + local_440._12_4_;
            fStack_870 = fStack_970 + local_440._16_4_;
            fStack_86c = fStack_96c + local_440._20_4_;
            fStack_868 = fStack_968 + local_440._24_4_;
            fStack_864 = fStack_964 + local_440._28_4_;
            _local_ac0 = local_440;
            do {
              auVar105._8_4_ = 0x7f800000;
              auVar105._0_8_ = 0x7f8000007f800000;
              auVar105._12_4_ = 0x7f800000;
              auVar105._16_4_ = 0x7f800000;
              auVar105._20_4_ = 0x7f800000;
              auVar105._24_4_ = 0x7f800000;
              auVar105._28_4_ = 0x7f800000;
              auVar273 = vblendvps_avx(auVar105,_local_ac0,auVar94);
              auVar97 = vshufps_avx(auVar273,auVar273,0xb1);
              auVar97 = vminps_avx(auVar273,auVar97);
              auVar153 = vshufpd_avx(auVar97,auVar97,5);
              auVar97 = vminps_avx(auVar97,auVar153);
              auVar153 = vpermpd_avx2(auVar97,0x4e);
              auVar97 = vminps_avx(auVar97,auVar153);
              auVar97 = vcmpps_avx(auVar273,auVar97,0);
              auVar153 = auVar94 & auVar97;
              auVar273 = auVar94;
              if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar153 >> 0x7f,0) != '\0') ||
                    (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar153 >> 0xbf,0) != '\0') ||
                  (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar153[0x1f] < '\0') {
                auVar273 = vandps_avx(auVar97,auVar94);
              }
              uVar69 = vmovmskps_avx(auVar273);
              iVar16 = 0;
              for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar70 = iVar16 << 2;
              local_940 = auVar94;
              *(undefined4 *)(local_940 + uVar70) = 0;
              uVar69 = *(uint *)(local_1c0 + uVar70);
              uVar70 = *(uint *)(local_420 + uVar70);
              fVar114 = auVar7._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                auVar266 = ZEXT1664(auVar266._0_16_);
                fVar114 = sqrtf((float)local_9e0._0_4_);
              }
              local_7a0._0_4_ = fVar114 * 1.9073486e-06;
              auVar166 = vinsertps_avx(ZEXT416(uVar70),ZEXT416(uVar69),0x10);
              lVar71 = 5;
              do {
                auVar116 = vmovshdup_avx(auVar166);
                fVar145 = 1.0 - auVar116._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar145);
                auVar147 = vshufps_avx(auVar166,auVar166,0x55);
                fVar114 = auVar147._0_4_;
                auVar124._0_4_ = fVar111 * fVar114;
                fVar137 = auVar147._4_4_;
                auVar124._4_4_ = auVar81._4_4_ * fVar137;
                fVar138 = auVar147._8_4_;
                auVar124._8_4_ = auVar81._8_4_ * fVar138;
                fVar139 = auVar147._12_4_;
                auVar124._12_4_ = auVar81._12_4_ * fVar139;
                auVar150._4_4_ = fVar145;
                auVar150._0_4_ = fVar145;
                auVar150._8_4_ = fVar145;
                auVar150._12_4_ = fVar145;
                auVar147 = vfmadd231ps_fma(auVar124,auVar150,auVar9);
                auVar167._0_4_ = fVar112 * fVar114;
                auVar167._4_4_ = auVar82._4_4_ * fVar137;
                auVar167._8_4_ = auVar82._8_4_ * fVar138;
                auVar167._12_4_ = auVar82._12_4_ * fVar139;
                auVar80 = vfmadd231ps_fma(auVar167,auVar150,auVar81);
                auVar212._0_4_ = fVar114 * auVar80._0_4_;
                auVar212._4_4_ = fVar137 * auVar80._4_4_;
                auVar212._8_4_ = fVar138 * auVar80._8_4_;
                auVar212._12_4_ = fVar139 * auVar80._12_4_;
                auVar117 = vfmadd231ps_fma(auVar212,auVar150,auVar147);
                auVar125._0_4_ = fVar114 * fVar113;
                auVar125._4_4_ = fVar137 * fStack_b2c;
                auVar125._8_4_ = fVar138 * fStack_b28;
                auVar125._12_4_ = fVar139 * fStack_b24;
                auVar147 = vfmadd231ps_fma(auVar125,auVar150,auVar82);
                auVar194._0_4_ = fVar114 * auVar147._0_4_;
                auVar194._4_4_ = fVar137 * auVar147._4_4_;
                auVar194._8_4_ = fVar138 * auVar147._8_4_;
                auVar194._12_4_ = fVar139 * auVar147._12_4_;
                auVar80 = vfmadd231ps_fma(auVar194,auVar150,auVar80);
                fVar141 = auVar166._0_4_;
                auVar126._4_4_ = fVar141;
                auVar126._0_4_ = fVar141;
                auVar126._8_4_ = fVar141;
                auVar126._12_4_ = fVar141;
                auVar147 = vfmadd213ps_fma(auVar126,local_9d0,_DAT_01f7aa10);
                auVar87._0_4_ = fVar114 * auVar80._0_4_;
                auVar87._4_4_ = fVar137 * auVar80._4_4_;
                auVar87._8_4_ = fVar138 * auVar80._8_4_;
                auVar87._12_4_ = fVar139 * auVar80._12_4_;
                auVar88 = vfmadd231ps_fma(auVar87,auVar117,auVar150);
                local_780._0_16_ = auVar88;
                auVar147 = vsubps_avx(auVar147,auVar88);
                _local_960 = auVar147;
                auVar147 = vdpps_avx(auVar147,auVar147,0x7f);
                fVar114 = auVar147._0_4_;
                if (fVar114 < 0.0) {
                  local_aa0._0_16_ = ZEXT416((uint)fVar145);
                  auVar266 = ZEXT1664(auVar266._0_16_);
                  auVar110._0_4_ = sqrtf(fVar114);
                  auVar110._4_60_ = extraout_var_00;
                  auVar88 = auVar110._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar147,auVar147);
                }
                auVar80 = vsubps_avx(auVar80,auVar117);
                auVar222._0_4_ = auVar80._0_4_ * 3.0;
                auVar222._4_4_ = auVar80._4_4_ * 3.0;
                auVar222._8_4_ = auVar80._8_4_ * 3.0;
                auVar222._12_4_ = auVar80._12_4_ * 3.0;
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_aa0._0_16_,auVar116);
                auVar117 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar116,local_aa0._0_16_)
                ;
                fVar137 = local_aa0._0_4_ * 6.0;
                fVar138 = auVar80._0_4_ * 6.0;
                fVar139 = auVar117._0_4_ * 6.0;
                fVar145 = auVar116._0_4_ * 6.0;
                auVar168._0_4_ = fVar145 * fVar113;
                auVar168._4_4_ = fVar145 * fStack_b2c;
                auVar168._8_4_ = fVar145 * fStack_b28;
                auVar168._12_4_ = fVar145 * fStack_b24;
                auVar127._4_4_ = fVar139;
                auVar127._0_4_ = fVar139;
                auVar127._8_4_ = fVar139;
                auVar127._12_4_ = fVar139;
                auVar116 = vfmadd132ps_fma(auVar127,auVar168,auVar82);
                auVar169._4_4_ = fVar138;
                auVar169._0_4_ = fVar138;
                auVar169._8_4_ = fVar138;
                auVar169._12_4_ = fVar138;
                auVar116 = vfmadd132ps_fma(auVar169,auVar116,auVar81);
                auVar80 = vdpps_avx(auVar222,auVar222,0x7f);
                auVar128._4_4_ = fVar137;
                auVar128._0_4_ = fVar137;
                auVar128._8_4_ = fVar137;
                auVar128._12_4_ = fVar137;
                auVar190 = vfmadd132ps_fma(auVar128,auVar116,auVar9);
                auVar116 = vblendps_avx(auVar80,_DAT_01f7aa10,0xe);
                auVar117 = vrsqrtss_avx(auVar116,auVar116);
                fVar139 = auVar80._0_4_;
                fVar137 = auVar117._0_4_;
                auVar117 = vdpps_avx(auVar222,auVar190,0x7f);
                fVar137 = fVar137 * 1.5 + fVar139 * -0.5 * fVar137 * fVar137 * fVar137;
                auVar129._0_4_ = auVar190._0_4_ * fVar139;
                auVar129._4_4_ = auVar190._4_4_ * fVar139;
                auVar129._8_4_ = auVar190._8_4_ * fVar139;
                auVar129._12_4_ = auVar190._12_4_ * fVar139;
                fVar138 = auVar117._0_4_;
                auVar213._0_4_ = auVar222._0_4_ * fVar138;
                auVar213._4_4_ = auVar222._4_4_ * fVar138;
                auVar213._8_4_ = auVar222._8_4_ * fVar138;
                auVar213._12_4_ = auVar222._12_4_ * fVar138;
                auVar117 = vsubps_avx(auVar129,auVar213);
                auVar116 = vrcpss_avx(auVar116,auVar116);
                auVar190 = vfnmadd213ss_fma(auVar116,auVar80,ZEXT416(0x40000000));
                fVar138 = auVar116._0_4_ * auVar190._0_4_;
                auVar116 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(fVar141 * (float)local_7a0._0_4_)));
                uVar72 = CONCAT44(auVar222._4_4_,auVar222._0_4_);
                auVar244._0_8_ = uVar72 ^ 0x8000000080000000;
                auVar244._8_4_ = -auVar222._8_4_;
                auVar244._12_4_ = -auVar222._12_4_;
                local_a40._0_4_ = fVar137 * auVar117._0_4_ * fVar138;
                local_a40._4_4_ = fVar137 * auVar117._4_4_ * fVar138;
                local_a40._8_4_ = fVar137 * auVar117._8_4_ * fVar138;
                local_a40._12_4_ = fVar137 * auVar117._12_4_ * fVar138;
                local_a20._0_4_ = auVar222._0_4_ * fVar137;
                local_a20._4_4_ = auVar222._4_4_ * fVar137;
                local_a20._8_4_ = auVar222._8_4_ * fVar137;
                local_a20._12_4_ = auVar222._12_4_ * fVar137;
                local_aa0._0_16_ = auVar222;
                if (fVar139 < -fVar139) {
                  auVar266 = ZEXT1664(auVar266._0_16_);
                  fVar137 = sqrtf(fVar139);
                  auVar88 = ZEXT416(auVar88._0_4_);
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar137 = auVar80._0_4_;
                }
                auVar80 = vdpps_avx(_local_960,local_a20._0_16_,0x7f);
                auVar79 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar88,
                                          ZEXT416((uint)auVar116._0_4_));
                auVar117 = vdpps_avx(auVar244,local_a20._0_16_,0x7f);
                auVar190 = vdpps_avx(_local_960,local_a40._0_16_,0x7f);
                local_a20._0_16_ = vdpps_avx(local_9d0,local_a20._0_16_,0x7f);
                auVar79 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_a00._0_4_ / fVar137)),auVar79)
                ;
                fVar137 = auVar117._0_4_ + auVar190._0_4_;
                auVar238 = ZEXT464((uint)fVar137);
                fVar139 = auVar80._0_4_;
                auVar89._0_4_ = fVar139 * fVar139;
                auVar89._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar89._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar89._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar117 = vdpps_avx(_local_960,auVar244,0x7f);
                auVar190 = vsubps_avx(auVar147,auVar89);
                auVar88 = vrsqrtss_avx(auVar190,auVar190);
                fVar145 = auVar190._0_4_;
                fVar138 = auVar88._0_4_;
                fVar138 = fVar138 * 1.5 + fVar145 * -0.5 * fVar138 * fVar138 * fVar138;
                auVar88 = vdpps_avx(_local_960,local_9d0,0x7f);
                local_a40._0_16_ = vfnmadd231ss_fma(auVar117,auVar80,ZEXT416((uint)fVar137));
                auVar117 = vfnmadd231ss_fma(auVar88,auVar80,local_a20._0_16_);
                if (fVar145 < 0.0) {
                  local_7c0._0_16_ = ZEXT416((uint)fVar137);
                  local_7e0._0_4_ = fVar138;
                  local_800._0_16_ = auVar117;
                  auVar266 = ZEXT1664(auVar266._0_16_);
                  fVar137 = sqrtf(fVar145);
                  auVar238 = ZEXT1664(local_7c0._0_16_);
                  fVar138 = (float)local_7e0._0_4_;
                  auVar117 = local_800._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar190,auVar190);
                  fVar137 = auVar88._0_4_;
                }
                auVar250 = ZEXT1664(auVar147);
                auVar271 = ZEXT3264(local_a80);
                auVar245 = ZEXT1664(local_aa0._0_16_);
                auVar88 = vpermilps_avx(local_780._0_16_,0xff);
                fVar137 = fVar137 - auVar88._0_4_;
                auVar190 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xff);
                auVar88 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar138),auVar190);
                auVar170._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
                auVar170._8_4_ = local_a20._8_4_ ^ 0x80000000;
                auVar170._12_4_ = local_a20._12_4_ ^ 0x80000000;
                auVar195._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar88._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar117 = ZEXT416((uint)(auVar117._0_4_ * fVar138));
                auVar115 = auVar238._0_16_;
                auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * local_a20._0_4_)),auVar115,
                                          auVar117);
                auVar117 = vinsertps_avx(auVar195,auVar117,0x1c);
                uVar77 = auVar88._0_4_;
                auVar196._4_4_ = uVar77;
                auVar196._0_4_ = uVar77;
                auVar196._8_4_ = uVar77;
                auVar196._12_4_ = uVar77;
                auVar117 = vdivps_avx(auVar117,auVar196);
                auVar88 = vinsertps_avx(auVar115,auVar170,0x10);
                auVar88 = vdivps_avx(auVar88,auVar196);
                auVar151._0_4_ = fVar139 * auVar117._0_4_ + fVar137 * auVar88._0_4_;
                auVar151._4_4_ = fVar139 * auVar117._4_4_ + fVar137 * auVar88._4_4_;
                auVar151._8_4_ = fVar139 * auVar117._8_4_ + fVar137 * auVar88._8_4_;
                auVar151._12_4_ = fVar139 * auVar117._12_4_ + fVar137 * auVar88._12_4_;
                auVar166 = vsubps_avx(auVar166,auVar151);
                auVar80 = vandps_avx(auVar80,auVar225);
                if (auVar80._0_4_ < auVar79._0_4_) {
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ + auVar116._0_4_)),
                                            local_820,ZEXT416(0x36000000));
                  auVar116 = vandps_avx(ZEXT416((uint)fVar137),auVar225);
                  if (auVar116._0_4_ < auVar80._0_4_) {
                    fVar137 = auVar166._0_4_ + (float)local_910._0_4_;
                    auVar116 = ZEXT416((uint)fVar137);
                    if ((fVar76 <= fVar137) &&
                       (fVar138 = *(float *)(ray + k * 4 + 0x80), fVar137 <= fVar138)) {
                      auVar80 = vmovshdup_avx(auVar166);
                      fVar139 = auVar80._0_4_;
                      if ((0.0 <= fVar139) && (fVar139 <= 1.0)) {
                        auVar80 = vrsqrtss_avx(auVar147,auVar147);
                        fVar145 = auVar80._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar67].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          fVar114 = fVar145 * 1.5 + fVar114 * -0.5 * fVar145 * fVar145 * fVar145;
                          auVar171._0_4_ = fVar114 * (float)local_960._0_4_;
                          auVar171._4_4_ = fVar114 * (float)local_960._4_4_;
                          auVar171._8_4_ = fVar114 * fStack_958;
                          auVar171._12_4_ = fVar114 * fStack_954;
                          auVar190 = vfmadd213ps_fma(auVar190,auVar171,local_aa0._0_16_);
                          auVar80 = vshufps_avx(auVar171,auVar171,0xc9);
                          auVar117 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xc9);
                          auVar172._0_4_ = auVar171._0_4_ * auVar117._0_4_;
                          auVar172._4_4_ = auVar171._4_4_ * auVar117._4_4_;
                          auVar172._8_4_ = auVar171._8_4_ * auVar117._8_4_;
                          auVar172._12_4_ = auVar171._12_4_ * auVar117._12_4_;
                          auVar88 = vfmsub231ps_fma(auVar172,local_aa0._0_16_,auVar80);
                          auVar80 = vshufps_avx(auVar88,auVar88,0xc9);
                          auVar117 = vshufps_avx(auVar190,auVar190,0xc9);
                          auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                          auVar90._0_4_ = auVar190._0_4_ * auVar88._0_4_;
                          auVar90._4_4_ = auVar190._4_4_ * auVar88._4_4_;
                          auVar90._8_4_ = auVar190._8_4_ * auVar88._8_4_;
                          auVar90._12_4_ = auVar190._12_4_ * auVar88._12_4_;
                          auVar80 = vfmsub231ps_fma(auVar90,auVar80,auVar117);
                          uVar77 = auVar80._0_4_;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar137;
                            uVar2 = vextractps_avx(auVar80,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar80,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar77;
                            *(float *)(ray + k * 4 + 0xf0) = fVar139;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_9a0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar67;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_710 = vshufps_avx(auVar166,auVar166,0x55);
                            auVar166 = vshufps_avx(auVar80,auVar80,0x55);
                            auStack_730 = vshufps_avx(auVar80,auVar80,0xaa);
                            local_740 = (RTCHitN  [16])auVar166;
                            local_720 = uVar77;
                            uStack_71c = uVar77;
                            uStack_718 = uVar77;
                            uStack_714 = uVar77;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar137;
                            local_900 = *local_a48;
                            local_af0.valid = (int *)local_900;
                            local_af0.geometryUserPtr = pGVar3->userPtr;
                            local_af0.context = context->user;
                            local_af0.hit = local_740;
                            local_af0.N = 4;
                            local_af0.ray = (RTCRayN *)ray;
                            if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar238 = ZEXT1664(auVar115);
                              auVar245 = ZEXT1664(local_aa0._0_16_);
                              auVar250 = ZEXT1664(auVar147);
                              auVar266 = ZEXT1664(auVar266._0_16_);
                              (*pGVar3->intersectionFilterN)(&local_af0);
                              auVar136._8_56_ = extraout_var_02;
                              auVar136._0_8_ = extraout_XMM1_Qa_00;
                              auVar116 = auVar136._0_16_;
                              auVar271 = ZEXT3264(local_a80);
                            }
                            if (local_900 == (undefined1  [16])0x0) {
                              auVar166 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar147 = vpcmpeqd_avx(auVar116,auVar116);
                              auVar166 = auVar166 ^ auVar147;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              auVar147 = vpcmpeqd_avx(auVar166,auVar166);
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar238 = ZEXT1664(auVar238._0_16_);
                                auVar245 = ZEXT1664(auVar245._0_16_);
                                auVar250 = ZEXT1664(auVar250._0_16_);
                                auVar266 = ZEXT1664(auVar266._0_16_);
                                (*p_Var4)(&local_af0);
                                auVar271 = ZEXT3264(local_a80);
                                auVar147 = vpcmpeqd_avx(auVar147,auVar147);
                              }
                              auVar116 = vpcmpeqd_avx(local_900,_DAT_01f7aa10);
                              auVar166 = auVar116 ^ auVar147;
                              if (local_900 != (undefined1  [16])0x0) {
                                auVar116 = auVar116 ^ auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    local_af0.hit);
                                *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x10));
                                *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x20));
                                *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x30));
                                *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x40));
                                *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x50));
                                *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x60));
                                *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x70));
                                *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar147;
                                auVar147 = vmaskmovps_avx(auVar116,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x80));
                                *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar147;
                              }
                            }
                            auVar91._8_8_ = 0x100000001;
                            auVar91._0_8_ = 0x100000001;
                            if ((auVar91 & auVar166) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar138;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar71 = lVar71 + -1;
              } while (lVar71 != 0);
              uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar103._4_4_ = uVar77;
              auVar103._0_4_ = uVar77;
              auVar103._8_4_ = uVar77;
              auVar103._12_4_ = uVar77;
              auVar103._16_4_ = uVar77;
              auVar103._20_4_ = uVar77;
              auVar103._24_4_ = uVar77;
              auVar103._28_4_ = uVar77;
              auVar273 = vcmpps_avx(_local_880,auVar103,2);
              auVar94 = vandps_avx(auVar273,local_940);
              auVar273 = local_940 & auVar273;
              local_940 = auVar94;
            } while ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar273 >> 0x7f,0) != '\0') ||
                       (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar273 >> 0xbf,0) != '\0') ||
                     (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar273[0x1f] < '\0');
          }
          auVar241 = ZEXT3264(local_440);
          auVar158._0_4_ = (float)local_980._0_4_ + local_480._0_4_;
          auVar158._4_4_ = (float)local_980._4_4_ + local_480._4_4_;
          auVar158._8_4_ = fStack_978 + local_480._8_4_;
          auVar158._12_4_ = fStack_974 + local_480._12_4_;
          auVar158._16_4_ = fStack_970 + local_480._16_4_;
          auVar158._20_4_ = fStack_96c + local_480._20_4_;
          auVar158._24_4_ = fStack_968 + local_480._24_4_;
          auVar158._28_4_ = fStack_964 + local_480._28_4_;
          auVar273 = vcmpps_avx(auVar158,auVar103,2);
          auVar94 = vandps_avx(local_5e0,local_5c0);
          auVar94 = vandps_avx(auVar273,auVar94);
          auVar182._0_4_ = local_440._0_4_ + (float)local_980._0_4_;
          auVar182._4_4_ = local_440._4_4_ + (float)local_980._4_4_;
          auVar182._8_4_ = local_440._8_4_ + fStack_978;
          auVar182._12_4_ = local_440._12_4_ + fStack_974;
          auVar182._16_4_ = local_440._16_4_ + fStack_970;
          auVar182._20_4_ = local_440._20_4_ + fStack_96c;
          auVar182._24_4_ = local_440._24_4_ + fStack_968;
          auVar182._28_4_ = local_440._28_4_ + fStack_964;
          auVar97 = vcmpps_avx(auVar182,auVar103,2);
          auVar273 = vandps_avx(local_8e0,local_8c0);
          auVar273 = vandps_avx(auVar97,auVar273);
          auVar273 = vorps_avx(auVar94,auVar273);
          if ((((((((auVar273 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar273 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar273 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar273 >> 0x7f,0) != '\0') ||
                (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar273 >> 0xbf,0) != '\0') ||
              (auVar273 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar273[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar75 * 0x60) = auVar273;
            auVar94 = vblendvps_avx(local_440,local_480,auVar94);
            *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar94;
            uVar78 = vmovlps_avx(local_550);
            (&uStack_140)[uVar75 * 0xc] = uVar78;
            aiStack_138[uVar75 * 0x18] = local_c48 + 1;
            iVar74 = iVar74 + 1;
          }
        }
      }
    }
    auVar273 = local_500;
    if (iVar74 == 0) break;
    uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar106._4_4_ = uVar77;
    auVar106._0_4_ = uVar77;
    auVar106._8_4_ = uVar77;
    auVar106._12_4_ = uVar77;
    auVar106._16_4_ = uVar77;
    auVar106._20_4_ = uVar77;
    auVar106._24_4_ = uVar77;
    auVar106._28_4_ = uVar77;
    uVar69 = -iVar74;
    pauVar68 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar74 - 1) * 0x60);
    fVar114 = (float)local_980._0_4_;
    fVar137 = (float)local_980._4_4_;
    fVar138 = fStack_978;
    fVar139 = fStack_974;
    fVar145 = fStack_970;
    fVar141 = fStack_96c;
    fVar143 = fStack_968;
    fVar140 = fStack_964;
    while( true ) {
      auVar94 = pauVar68[1];
      auVar132._0_4_ = fVar114 + auVar94._0_4_;
      auVar132._4_4_ = fVar137 + auVar94._4_4_;
      auVar132._8_4_ = fVar138 + auVar94._8_4_;
      auVar132._12_4_ = fVar139 + auVar94._12_4_;
      auVar132._16_4_ = fVar145 + auVar94._16_4_;
      auVar132._20_4_ = fVar141 + auVar94._20_4_;
      auVar132._24_4_ = fVar143 + auVar94._24_4_;
      auVar132._28_4_ = fVar140 + auVar94._28_4_;
      auVar153 = vcmpps_avx(auVar132,auVar106,2);
      auVar97 = vandps_avx(auVar153,*pauVar68);
      _local_740 = auVar97;
      auVar153 = *pauVar68 & auVar153;
      if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar153 >> 0x7f,0) != '\0') ||
            (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar153 >> 0xbf,0) != '\0') ||
          (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar153[0x1f] < '\0') break;
      pauVar68 = pauVar68 + -3;
      uVar69 = uVar69 + 1;
      fVar114 = (float)local_980._0_4_;
      fVar137 = (float)local_980._4_4_;
      fVar138 = fStack_978;
      fVar139 = fStack_974;
      fVar145 = fStack_970;
      fVar141 = fStack_96c;
      fVar143 = fStack_968;
      fVar140 = fStack_964;
      if (uVar69 == 0) goto LAB_01635125;
    }
    auVar107._8_4_ = 0x7f800000;
    auVar107._0_8_ = 0x7f8000007f800000;
    auVar107._12_4_ = 0x7f800000;
    auVar107._16_4_ = 0x7f800000;
    auVar107._20_4_ = 0x7f800000;
    auVar107._24_4_ = 0x7f800000;
    auVar107._28_4_ = 0x7f800000;
    auVar94 = vblendvps_avx(auVar107,auVar94,auVar97);
    auVar153 = vshufps_avx(auVar94,auVar94,0xb1);
    auVar153 = vminps_avx(auVar94,auVar153);
    auVar11 = vshufpd_avx(auVar153,auVar153,5);
    auVar153 = vminps_avx(auVar153,auVar11);
    auVar11 = vpermpd_avx2(auVar153,0x4e);
    auVar153 = vminps_avx(auVar153,auVar11);
    auVar94 = vcmpps_avx(auVar94,auVar153,0);
    auVar153 = auVar97 & auVar94;
    if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar153 >> 0x7f,0) != '\0') ||
          (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar153 >> 0xbf,0) != '\0') ||
        (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar153[0x1f] < '\0') {
      auVar97 = vandps_avx(auVar94,auVar97);
    }
    uVar72 = *(ulong *)pauVar68[2];
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar72;
    uVar70 = vmovmskps_avx(auVar97);
    iVar74 = 0;
    for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
      iVar74 = iVar74 + 1;
    }
    *(undefined4 *)(local_740 + (uint)(iVar74 << 2)) = 0;
    uVar70 = ~uVar69;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar70 = -uVar69;
    }
    uVar75 = (ulong)uVar70;
    local_c48 = *(int *)(pauVar68[2] + 8);
    *pauVar68 = _local_740;
    uVar77 = (undefined4)uVar72;
    auVar133._4_4_ = uVar77;
    auVar133._0_4_ = uVar77;
    auVar133._8_4_ = uVar77;
    auVar133._12_4_ = uVar77;
    auVar133._16_4_ = uVar77;
    auVar133._20_4_ = uVar77;
    auVar133._24_4_ = uVar77;
    auVar133._28_4_ = uVar77;
    auVar166 = vmovshdup_avx(auVar92);
    auVar166 = vsubps_avx(auVar166,auVar92);
    auVar108._0_4_ = auVar166._0_4_;
    auVar108._4_4_ = auVar108._0_4_;
    auVar108._8_4_ = auVar108._0_4_;
    auVar108._12_4_ = auVar108._0_4_;
    auVar108._16_4_ = auVar108._0_4_;
    auVar108._20_4_ = auVar108._0_4_;
    auVar108._24_4_ = auVar108._0_4_;
    auVar108._28_4_ = auVar108._0_4_;
    auVar166 = vfmadd132ps_fma(auVar108,auVar133,_DAT_01faff20);
    local_480 = ZEXT1632(auVar166);
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_480 + (uint)(iVar74 << 2));
  } while( true );
LAB_01635125:
  uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar93._4_4_ = uVar77;
  auVar93._0_4_ = uVar77;
  auVar93._8_4_ = uVar77;
  auVar93._12_4_ = uVar77;
  auVar5 = vcmpps_avx(local_560,auVar93,2);
  uVar67 = vmovmskps_avx(auVar5);
  uVar67 = (uint)uVar73 & uVar67;
  if (uVar67 == 0) {
    return;
  }
  goto LAB_016328ec;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }